

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

InterfaceText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeInterfaceText
          (InterfaceText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr scope,StringPtr name,
          InterfaceSchema schema,Array<kj::StringTree> nestedTypeDecls,
          TemplateContext *templateContext)

{
  undefined8 *puVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  ArrayDisposer *pAVar6;
  Branch *pBVar7;
  size_t sVar8;
  Method method;
  StringPtr hexId_00;
  size_t sVar9;
  ArrayDisposer *pAVar10;
  ExtendInfo *firstElement;
  Branch *pBVar11;
  undefined8 uVar12;
  bool bVar13;
  int iVar14;
  size_t *psVar15;
  size_t sVar16;
  ExtendInfo *pEVar17;
  uint64_t uVar18;
  StringTree *pSVar19;
  _Base_ptr p_Var20;
  StringTree *pSVar21;
  InterfaceText *pIVar22;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  InterfaceText *extraout_RAX;
  undefined4 extraout_var_44;
  Schema params_1;
  ArrayPtr<const_char> *pAVar23;
  ArrayPtr<const_char> *params_1_00;
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  *extraout_RDX;
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  *extraout_RDX_00;
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  *map_00;
  CppTypeName *value_00;
  long lVar24;
  ulong uVar25;
  long lVar26;
  char *pcVar27;
  unsigned_long uVar28;
  char *pcVar29;
  char (*params_2) [3];
  char (*pacVar30) [3];
  char (*pacVar31) [9];
  char (*pacVar32) [9];
  code *brandInitializers_00;
  uint index;
  TemplateContext *templateContext_00;
  ElementCount index_00;
  long lVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  StringPtr suffix;
  StringPtr interfaceName;
  StringPtr delim;
  StringPtr delim_00;
  StringPtr delim_01;
  StringPtr delim_02;
  StringPtr delim_03;
  StringPtr type;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  pVar38;
  StringPtr innerName;
  StringPtr fullName_00;
  StringPtr suffix_00;
  StringPtr suffix_01;
  char (*params_11) [26];
  StringTree *in_stack_fffffffffffff578;
  StringTree local_a78;
  ExtendInfo *local_a38;
  StringTree local_a30;
  StringTree *local_9f8;
  InterfaceSchema schema_local;
  String fullName;
  BrandInitializerText brandInitializers;
  char *local_918;
  size_t sStack_910;
  ArrayDisposer *local_908;
  Branch *pBStack_900;
  size_t local_8f8;
  ArrayDisposer *local_8f0;
  size_t local_8e8;
  char *local_8e0;
  size_t sStack_8d8;
  ArrayDisposer *local_8d0;
  Branch *pBStack_8c8;
  size_t local_8c0;
  ArrayDisposer *local_8b8;
  String result_2;
  ArrayDisposer *local_890;
  Branch *local_888;
  size_t sStack_880;
  ArrayDisposer *local_878;
  StringTree declareText;
  Array<kj::StringTree> result_10;
  Array<kj::StringTree> result_9;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> transitiveSuperclasses;
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  map;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> methods;
  CppTypeName typeName;
  StringPtr name_local;
  StringTree defineText;
  String local_6f0;
  Array<kj::StringTree> result_8;
  Array<kj::StringTree> result_11;
  Branch *local_698;
  size_t local_690;
  ArrayDisposer *local_688;
  ArrayDisposer *local_680;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> superclasses;
  Array<kj::StringTree> result_7;
  Array<kj::StringTree> result_6;
  Array<kj::StringTree> result_5;
  Array<kj::StringTree> result_4;
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [24];
  CppTypeName *local_5b0;
  undefined1 local_5a8 [24];
  ArrayDisposer *local_590;
  undefined1 local_588 [16];
  undefined1 local_578 [24];
  ArrayDisposer *local_560;
  Reader proto;
  StringTree local_528;
  StringTree local_4e8;
  StringTree local_4a8;
  long local_468;
  undefined8 uStack_460;
  undefined8 *local_458;
  Array<kj::StringTree> result_3;
  String templates;
  undefined1 local_3f0 [8];
  char *local_3e8;
  Branch *local_3d0;
  StringPtr scope_local;
  String local_3b8;
  ArrayDisposer *pAStack_3a0;
  ArrayPtr<const_char> local_398;
  ArrayPtr<const_char> local_388;
  undefined1 local_378 [24];
  long local_360;
  ArrayPtr<const_char> local_358;
  ArrayPtr<const_char> local_348;
  undefined1 local_338 [24];
  long local_320;
  ArrayPtr<const_char> local_318;
  StringTree local_308;
  StringTree local_2d0;
  StringTree local_298;
  StringTree local_260;
  StringTree local_228;
  StringTree local_1f0;
  StringTree local_1b8;
  StringTree local_180;
  StringTree local_148;
  CappedArray<char,_17UL> hexId;
  undefined1 local_f0 [24];
  ArrayDisposer *local_d8;
  Branch *pBStack_d0;
  ArrayDisposer *local_c8;
  Branch *pBStack_c0;
  size_t local_b8;
  ArrayDisposer *pAStack_b0;
  size_t local_a8;
  char *local_a0;
  size_t local_98;
  ArrayDisposer *local_90;
  Branch *pBStack_88;
  size_t local_80;
  ArrayDisposer *local_78;
  size_t local_70;
  char *local_68;
  size_t local_60;
  ArrayDisposer *local_58;
  Branch *pBStack_50;
  size_t local_48;
  ArrayDisposer *local_40;
  size_t local_38;
  CppTypeName *value;
  
  sVar3 = sStack_880;
  pBVar11 = local_888;
  pSVar21 = (StringTree *)name.content.ptr;
  schema_local = schema;
  suffix.content.size_ = 1;
  suffix.content.ptr = "";
  pSVar19 = pSVar21;
  name_local.content.ptr = (char *)pSVar21;
  name_local.content.size_ = name.content.size_;
  scope_local.content.ptr = scope.content.ptr;
  scope_local.content.size_ = scope.content.size_;
  TemplateContext::args(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_,suffix);
  typeName.name.text.content.ptr = (char *)(scope.content.size_ - 1);
  map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = name.content.size_ - 1;
  map._M_t._M_impl._0_8_ = pSVar21;
  typeName.name.size_ = (size_t)scope.content.ptr;
  kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
            (&fullName,(_ *)&typeName,(ArrayPtr<const_char> *)&map,
             (ArrayPtr<const_char> *)&brandInitializers,pSVar19);
  sVar16 = brandInitializers.scopes.branches.size_;
  pBVar7 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.branches.disposer,pBVar7,0x40,sVar16,sVar16,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar16 = brandInitializers.scopes.text.content.size_;
  pcVar27 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.text.content.disposer,pcVar27,1,sVar16,sVar16,0);
  }
  InterfaceSchema::getMethods((MethodList *)&local_a78,&schema_local);
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_a78.branches.ptr;
  map._M_t._M_impl.super__Rb_tree_header._M_node_count = local_a78.branches.size_;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_a78.text.content.size_;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_a78.text.content.disposer;
  map._M_t._M_impl._0_8_ = local_a78.size_;
  map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_a78.text.content.ptr;
  uVar25 = (ulong)local_a78.branches.ptr & 0xffffffff;
  psVar15 = (size_t *)
            kj::_::HeapArrayDisposer::allocateImpl
                      (0x118,0,uVar25,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_a30.text.content.size_ = (size_t)(psVar15 + uVar25 * 0x23);
  local_a30.text.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_a38 = (ExtendInfo *)psVar15;
  local_a30.size_ = (size_t)psVar15;
  if ((ElementCount)map._M_t._M_impl.super__Rb_tree_header._M_header._M_right != 0) {
    index_00 = 0;
    do {
      uVar12 = map._M_t._M_impl._0_8_;
      _::ListReader::getStructElement
                ((StructReader *)&typeName.name.text.content.size_,
                 (ListReader *)&map._M_t._M_impl.super__Rb_tree_header,index_00);
      typeName.name.size_ = uVar12;
      typeName.name.text.content.ptr =
           (char *)CONCAT62(typeName.name.text.content.ptr._2_6_,(short)index_00);
      pcVar27 = "";
      if (fullName.content.size_ != 0) {
        pcVar27 = fullName.content.ptr;
      }
      interfaceName.content.size_ = fullName.content.size_ + (fullName.content.size_ == 0);
      method.proto._reader._44_4_ = typeName._60_4_;
      method.proto._reader.nestingLimit._0_1_ = typeName.isArgDependent;
      method.proto._reader.nestingLimit._1_1_ = typeName.needsTypename;
      method.proto._reader.nestingLimit._2_1_ = typeName.hasInterfaces_;
      method.proto._reader.nestingLimit._3_1_ = typeName.hasDisambiguatedTemplate_;
      method._8_8_ = typeName.name.text.content.ptr;
      method.parent.super_Schema.raw = (Schema)(Schema)uVar12;
      method.proto._reader.segment = (SegmentReader *)typeName.name.text.content.size_;
      method.proto._reader.capTable = (CapTableReader *)typeName.name.text.content.disposer;
      method.proto._reader.data = typeName.name.branches.ptr;
      method.proto._reader.pointers = (WirePointer *)typeName.name.branches.size_;
      method.proto._reader._32_8_ = typeName.name.branches.disposer;
      interfaceName.content.ptr = pcVar27;
      makeMethodText((MethodText *)&brandInitializers,this,interfaceName,method,
                     (TemplateContext *)nestedTypeDecls.size_);
      *psVar15 = brandInitializers.scopes.size_;
      psVar15[1] = (size_t)brandInitializers.scopes.text.content.ptr;
      psVar15[2] = brandInitializers.scopes.text.content.size_;
      brandInitializers.scopes.text.content.ptr = (char *)0x0;
      brandInitializers.scopes.text.content.size_ = 0;
      psVar15[3] = (size_t)brandInitializers.scopes.text.content.disposer;
      psVar15[4] = (size_t)brandInitializers.scopes.branches.ptr;
      psVar15[5] = brandInitializers.scopes.branches.size_;
      psVar15[6] = (size_t)brandInitializers.scopes.branches.disposer;
      brandInitializers.scopes.branches.ptr = (Branch *)0x0;
      brandInitializers.scopes.branches.size_ = 0;
      psVar15[7] = brandInitializers.bindings.size_;
      psVar15[8] = (size_t)brandInitializers.bindings.text.content.ptr;
      psVar15[9] = brandInitializers.bindings.text.content.size_;
      brandInitializers.bindings.text.content.ptr = (char *)0x0;
      brandInitializers.bindings.text.content.size_ = 0;
      psVar15[10] = (size_t)brandInitializers.bindings.text.content.disposer;
      psVar15[0xb] = (size_t)brandInitializers.bindings.branches.ptr;
      psVar15[0xc] = brandInitializers.bindings.branches.size_;
      psVar15[0xd] = (size_t)brandInitializers.bindings.branches.disposer;
      brandInitializers.bindings.branches.ptr = (Branch *)0x0;
      brandInitializers.bindings.branches.size_ = 0;
      psVar15[0xe] = brandInitializers.dependencies.size_;
      psVar15[0xf] = (size_t)brandInitializers.dependencies.text.content.ptr;
      psVar15[0x10] = brandInitializers.dependencies.text.content.size_;
      brandInitializers.dependencies.text.content.ptr = (char *)0x0;
      brandInitializers.dependencies.text.content.size_ = 0;
      psVar15[0x11] = (size_t)brandInitializers.dependencies.text.content.disposer;
      psVar15[0x12] = (size_t)brandInitializers.dependencies.branches.ptr;
      psVar15[0x13] = brandInitializers.dependencies.branches.size_;
      psVar15[0x14] = (size_t)brandInitializers.dependencies.branches.disposer;
      brandInitializers.dependencies.branches.ptr = (Branch *)0x0;
      brandInitializers.dependencies.branches.size_ = 0;
      psVar15[0x15] = brandInitializers.dependencyCount;
      psVar15[0x16] = (size_t)local_918;
      psVar15[0x17] = sStack_910;
      local_918 = (char *)0x0;
      sStack_910 = 0;
      psVar15[0x18] = (size_t)local_908;
      psVar15[0x19] = (size_t)pBStack_900;
      psVar15[0x1a] = local_8f8;
      psVar15[0x1b] = (size_t)local_8f0;
      pBStack_900 = (Branch *)0x0;
      local_8f8 = 0;
      psVar15[0x1c] = local_8e8;
      psVar15[0x1d] = (size_t)local_8e0;
      psVar15[0x1e] = sStack_8d8;
      local_8e0 = (char *)0x0;
      sStack_8d8 = 0;
      psVar15[0x1f] = (size_t)local_8d0;
      psVar15[0x20] = (size_t)pBStack_8c8;
      psVar15[0x21] = local_8c0;
      psVar15[0x22] = (size_t)local_8b8;
      pBStack_8c8 = (Branch *)0x0;
      local_8c0 = 0;
      psVar15 = psVar15 + 0x23;
      MethodText::~MethodText((MethodText *)&brandInitializers);
      index_00 = index_00 + 1;
    } while (index_00 != (ElementCount)map._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  }
  firstElement = local_a38;
  lVar24 = (long)psVar15 - (long)local_a38 >> 3;
  sVar16 = lVar24 * -0x5075075075075075;
  Schema::getProto(&proto,&schema_local.super_Schema);
  if (proto._reader.dataSize < 0x40) {
    uVar28 = 0;
  }
  else {
    uVar28 = *proto._reader.data;
  }
  kj::hex(&hexId,uVar28);
  InterfaceSchema::getSuperclasses((SuperclassList *)&local_a78,&schema_local);
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_a78.branches.ptr;
  map._M_t._M_impl.super__Rb_tree_header._M_node_count = local_a78.branches.size_;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_a78.text.content.size_;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_a78.text.content.disposer;
  map._M_t._M_impl._0_8_ = local_a78.size_;
  map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_a78.text.content.ptr;
  uVar25 = (ulong)local_a78.branches.ptr & 0xffffffff;
  pEVar17 = (ExtendInfo *)
            kj::_::HeapArrayDisposer::allocateImpl
                      (0x48,0,uVar25,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_a30.text.content.size_ = (size_t)(pEVar17 + uVar25);
  local_a30.text.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  map_00 = extraout_RDX;
  local_a38 = pEVar17;
  local_a30.size_ = (size_t)pEVar17;
  if ((ElementCount)map._M_t._M_impl.super__Rb_tree_header._M_header._M_right != 0) {
    index = 0;
    do {
      result_2.content.ptr =
           (char *)InterfaceSchema::SuperclassList::operator[]((SuperclassList *)&map,index);
      brandInitializers.scopes.size_ = brandInitializers.scopes.size_ & 0xffffffffffffff00;
      cppFullName(&typeName,this,(Schema)result_2.content.ptr,(Schema)result_2.content.ptr,
                  (Maybe<capnp::InterfaceSchema::Method> *)&brandInitializers);
      Schema::getProto((Reader *)&brandInitializers,(Schema *)&result_2);
      if ((uint)brandInitializers.scopes.branches.ptr < 0x40) {
        uVar18 = 0;
      }
      else {
        uVar18 = *(uint64_t *)brandInitializers.scopes.text.content.size_;
      }
      (pEVar17->typeName).name.size_ = typeName.name.size_;
      (pEVar17->typeName).name.text.content.ptr = typeName.name.text.content.ptr;
      (pEVar17->typeName).name.text.content.size_ = typeName.name.text.content.size_;
      typeName.name.text.content.ptr = (char *)0x0;
      typeName.name.text.content.size_ = 0;
      (pEVar17->typeName).name.text.content.disposer = typeName.name.text.content.disposer;
      (pEVar17->typeName).name.branches.ptr = typeName.name.branches.ptr;
      (pEVar17->typeName).name.branches.size_ = typeName.name.branches.size_;
      (pEVar17->typeName).name.branches.disposer = typeName.name.branches.disposer;
      typeName.name.branches.ptr = (Branch *)0x0;
      typeName.name.branches.size_ = 0;
      (pEVar17->typeName).isArgDependent = typeName.isArgDependent;
      (pEVar17->typeName).needsTypename = typeName.needsTypename;
      (pEVar17->typeName).hasInterfaces_ = typeName.hasInterfaces_;
      (pEVar17->typeName).hasDisambiguatedTemplate_ = typeName.hasDisambiguatedTemplate_;
      pEVar17->id = uVar18;
      pEVar17 = pEVar17 + 1;
      index = index + 1;
      map_00 = extraout_RDX_00;
    } while (index != (ElementCount)map._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  }
  superclasses.size_ = ((long)pEVar17 - (long)local_a38 >> 3) * -0x71c71c71c71c71c7;
  superclasses.ptr = local_a38;
  superclasses.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map._M_t._M_impl.super__Rb_tree_header._M_header;
  map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  getTransitiveSuperclasses
            ((CapnpcCppMain *)schema_local.super_Schema.raw,(InterfaceSchema)&map,map_00);
  Schema::getProto((Reader *)&brandInitializers,&schema_local.super_Schema);
  if ((uint)brandInitializers.scopes.branches.ptr < 0x40) {
    typeName.name.size_ = 0;
  }
  else {
    typeName.name.size_ = *(size_t *)brandInitializers.scopes.text.content.size_;
  }
  pVar38 = std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::InterfaceSchema>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
           ::equal_range(&map._M_t,(key_type *)&typeName);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::InterfaceSchema>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  ::_M_erase_aux(&map._M_t,(_Base_ptr)pVar38.first._M_node,(_Base_ptr)pVar38.second._M_node);
  sVar9 = map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pSVar19 = (StringTree *)
            kj::_::HeapArrayDisposer::allocateImpl
                      (0x48,0,map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_a78.text.content.size_ = (long)pSVar19 + sVar9 * 0x48;
  local_a78.text.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_a78.size_ = (size_t)pSVar19;
  local_a78.text.content.ptr = (char *)pSVar19;
  if ((_Rb_tree_header *)map._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &map._M_t._M_impl.super__Rb_tree_header) {
    p_Var20 = map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      brandInitializers.scopes.size_ = brandInitializers.scopes.size_ & 0xffffffffffffff00;
      cppFullName(&typeName,this,(RawBrandedSchema *)p_Var20[1]._M_parent,
                  (RawBrandedSchema *)p_Var20[1]._M_parent,
                  (Maybe<capnp::InterfaceSchema::Method> *)&brandInitializers);
      Schema::getProto((Reader *)&brandInitializers,(Schema *)&p_Var20[1]._M_parent);
      if ((uint)brandInitializers.scopes.branches.ptr < 0x40) {
        pcVar27 = (char *)0x0;
      }
      else {
        pcVar27 = *(char **)brandInitializers.scopes.text.content.size_;
      }
      *(size_t *)local_a78.text.content.ptr = typeName.name.size_;
      (((String *)((long)local_a78.text.content.ptr + 8))->content).ptr =
           typeName.name.text.content.ptr;
      (((String *)((long)local_a78.text.content.ptr + 8))->content).size_ =
           typeName.name.text.content.size_;
      typeName.name.text.content.ptr = (char *)0x0;
      typeName.name.text.content.size_ = 0;
      (((String *)((long)local_a78.text.content.ptr + 8))->content).disposer =
           typeName.name.text.content.disposer;
      ((Array<kj::StringTree::Branch> *)((long)local_a78.text.content.ptr + 0x20))->ptr =
           typeName.name.branches.ptr;
      ((Array<kj::StringTree::Branch> *)((long)local_a78.text.content.ptr + 0x20))->size_ =
           typeName.name.branches.size_;
      ((Array<kj::StringTree::Branch> *)((long)local_a78.text.content.ptr + 0x20))->disposer =
           typeName.name.branches.disposer;
      typeName.name.branches.ptr = (Branch *)0x0;
      typeName.name.branches.size_ = 0;
      *(undefined4 *)&((StringTree *)((long)local_a78.text.content.ptr + 0x38))->size_ =
           typeName._56_4_;
      (((StringTree *)((long)local_a78.text.content.ptr + 0x38))->text).content.ptr = pcVar27;
      pSVar19 = (StringTree *)
                &(((StringTree *)((long)local_a78.text.content.ptr + 0x38))->text).content.size_;
      local_a78.text.content.ptr = (char *)pSVar19;
      p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
    } while ((_Rb_tree_header *)p_Var20 != &map._M_t._M_impl.super__Rb_tree_header);
  }
  pAVar10 = local_a78.text.content.disposer;
  sVar9 = local_a78.size_;
  lVar26 = (long)((long)pSVar19 - local_a78.size_) >> 3;
  pcVar27 = (char *)(lVar26 * -0x71c71c71c71c71c7);
  local_a30.text.content.size_ = (size_t)local_a78.text.content.disposer;
  local_a30.size_ = local_a78.size_;
  local_a30.text.content.ptr = pcVar27;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::InterfaceSchema>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  ::~_Rb_tree(&map._M_t);
  brandInitializers.scopes.size_ = brandInitializers.scopes.size_ & 0xffffffffffffff00;
  cppFullName(&typeName,this,schema_local.super_Schema.raw,schema_local.super_Schema.raw,
              (Maybe<capnp::InterfaceSchema::Method> *)&brandInitializers);
  kj::StringTree::flatten((String *)&brandInitializers,&typeName.name);
  map._M_t._M_impl._0_8_ = brandInitializers.scopes.text.content.ptr + -1;
  if (brandInitializers.scopes.text.content.ptr == (char *)0x0) {
    map._M_t._M_impl._0_8_ = (char *)0x0;
  }
  map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = brandInitializers.scopes.size_;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)brandInitializers.scopes.text.content.ptr;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)brandInitializers.scopes.text.content.size_;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  innerName.content.size_ = 7;
  innerName.content.ptr = "Client";
  params_2 = (char (*) [3])brandInitializers.scopes.text.content.size_;
  CppTypeName::addMemberType((CppTypeName *)&map,innerName);
  TemplateContext::allDecls(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_);
  brandInitializers_00 = (code *)&templates;
  kj::_::concat<kj::StringTree>((String *)brandInitializers_00,&brandInitializers.scopes);
  pacVar30 = (char (*) [3])brandInitializers.scopes.branches.size_;
  pBVar7 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.branches.disposer,pBVar7,0x40,pacVar30,pacVar30,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    params_2 = pacVar30;
  }
  pacVar30 = (char (*) [3])brandInitializers.scopes.text.content.size_;
  pcVar29 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.text.content.disposer,pcVar29,1,pacVar30,pacVar30,0);
    params_2 = pacVar30;
  }
  params_11 = (char (*) [26])0x168d25;
  kj::strTree<char_const(&)[79],kj::CappedArray<char,17ul>&,char_const(&)[3]>
            (&declareText,
             (kj *)
             "  #if !CAPNP_LITE\n  struct _capnpPrivate {\n    CAPNP_DECLARE_INTERFACE_HEADER(",
             (char (*) [79])&hexId,(CappedArray<char,_17UL> *)")\n",params_2);
  pSVar19 = (StringTree *)0x2214fe;
  kj::
  strTree<char_const(&)[4],kj::String&,char_const(&)[2],char_const(&)[17],kj::String&,char_const(&)[25],kj::String&,char_const(&)[24],kj::String&,char_const(&)[40],kj::String&,char_const(&)[26]>
            (&defineText,(kj *)"// ",(char (*) [4])&fullName,(String *)0x2214fe,
             (char (*) [2])0x220c7c,(char (*) [17])brandInitializers_00,
             (String *)"constexpr ::capnp::Kind ",(char (*) [25])&fullName,
             (String *)"::_capnpPrivate::kind;\n",(char (*) [24])brandInitializers_00,
             (String *)"constexpr ::capnp::_::RawSchema const* ",(char (*) [40])&fullName,
             (String *)"::_capnpPrivate::schema;\n",params_11);
  if ((*(uint *)(nestedTypeDecls.size_ + 0x38) < 0x121) ||
     ((*(byte *)(*(long *)(nestedTypeDecls.size_ + 0x28) + 0x24) & 1) == 0)) {
    local_a78.size_ = 0x222ed9;
    local_a78.text.content.ptr = (char *)0x63;
    kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
              (&brandInitializers.scopes,&declareText,&local_a78,(ArrayPtr<const_char> *)pSVar19);
    pSVar21 = (StringTree *)declareText.text.content.size_;
    pcVar29 = declareText.text.content.ptr;
    declareText.size_ = brandInitializers.scopes.size_;
    if (declareText.text.content.ptr != (char *)0x0) {
      declareText.text.content.ptr = (char *)0x0;
      declareText.text.content.size_ = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(declareText.text.content.disposer._4_4_,
                           declareText.text.content.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(declareText.text.content.disposer._4_4_,
                          declareText.text.content.disposer._0_4_),pcVar29,1,pSVar21,pSVar21,0);
      pSVar19 = pSVar21;
    }
    pSVar21 = (StringTree *)declareText.branches.size_;
    pBVar7 = declareText.branches.ptr;
    declareText.text.content.ptr = brandInitializers.scopes.text.content.ptr;
    declareText.text.content.size_ = brandInitializers.scopes.text.content.size_;
    declareText.text.content.disposer._0_4_ = brandInitializers.scopes.text.content.disposer._0_4_;
    declareText.text.content.disposer._4_4_ = brandInitializers.scopes.text.content.disposer._4_4_;
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    if (declareText.branches.ptr != (Branch *)0x0) {
      declareText.branches.ptr = (Branch *)0x0;
      declareText.branches.size_ = 0;
      (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
                (declareText.branches.disposer,pBVar7,0x40,pSVar21,pSVar21,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      pSVar19 = pSVar21;
    }
    pSVar21 = (StringTree *)brandInitializers.scopes.text.content.size_;
    pcVar29 = brandInitializers.scopes.text.content.ptr;
    declareText.branches.ptr = brandInitializers.scopes.branches.ptr;
    declareText.branches.size_ = brandInitializers.scopes.branches.size_;
    declareText.branches.disposer = brandInitializers.scopes.branches.disposer;
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
      brandInitializers.scopes.text.content.ptr = (char *)0x0;
      brandInitializers.scopes.text.content.size_ = 0;
      (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
                (brandInitializers.scopes.text.content.disposer,pcVar29,1,pSVar21,pSVar21,0);
      pSVar19 = pSVar21;
    }
  }
  else {
    params_1 = schema_local.super_Schema.raw;
    makeBrandInitializers
              (&brandInitializers,this,(TemplateContext *)nestedTypeDecls.size_,
               schema_local.super_Schema.raw);
    makeGenericDeclarations
              (&local_a30,(CapnpcCppMain *)nestedTypeDecls.size_,
               (TemplateContext *)(ulong)(brandInitializers.dependencies.size_ != 0),
               SUB81(params_1.raw,0));
    kj::StringTree::concat<kj::StringTree,kj::StringTree>
              (&local_a78,&declareText,&local_a30,(StringTree *)params_1.raw);
    sVar2 = declareText.text.content.size_;
    pcVar29 = declareText.text.content.ptr;
    declareText.size_ = local_a78.size_;
    if (declareText.text.content.ptr != (char *)0x0) {
      declareText.text.content.ptr = (char *)0x0;
      declareText.text.content.size_ = 0;
      brandInitializers_00 = (code *)0x0;
      (*(code *)**(undefined8 **)
                  CONCAT44(declareText.text.content.disposer._4_4_,
                           declareText.text.content.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(declareText.text.content.disposer._4_4_,
                          declareText.text.content.disposer._0_4_),pcVar29,1,sVar2,sVar2);
    }
    sVar2 = declareText.branches.size_;
    pBVar7 = declareText.branches.ptr;
    declareText.text.content.ptr = local_a78.text.content.ptr;
    declareText.text.content.size_ = local_a78.text.content.size_;
    declareText.text.content.disposer._0_4_ = local_a78.text.content.disposer._0_4_;
    declareText.text.content.disposer._4_4_ = local_a78.text.content.disposer._4_4_;
    local_a78.text.content.ptr = (char *)0x0;
    local_a78.text.content.size_ = 0;
    if (declareText.branches.ptr != (Branch *)0x0) {
      declareText.branches.ptr = (Branch *)0x0;
      declareText.branches.size_ = 0;
      brandInitializers_00 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
      (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
                (declareText.branches.disposer,pBVar7,0x40,sVar2,sVar2);
    }
    sVar2 = local_a78.text.content.size_;
    pcVar29 = local_a78.text.content.ptr;
    declareText.branches.ptr = local_a78.branches.ptr;
    declareText.branches.size_ = local_a78.branches.size_;
    declareText.branches.disposer = local_a78.branches.disposer;
    local_a78.branches.ptr = (Branch *)0x0;
    local_a78.branches.size_ = 0;
    if (local_a78.text.content.ptr != (char *)0x0) {
      local_a78.text.content.ptr = (char *)0x0;
      local_a78.text.content.size_ = 0;
      brandInitializers_00 = (code *)0x0;
      (**(local_a78.text.content.disposer)->_vptr_ArrayDisposer)
                (local_a78.text.content.disposer,pcVar29,1,sVar2,sVar2);
    }
    sVar2 = local_a30.branches.size_;
    pBVar7 = local_a30.branches.ptr;
    if (local_a30.branches.ptr != (Branch *)0x0) {
      local_a30.branches.ptr = (Branch *)0x0;
      local_a30.branches.size_ = 0;
      brandInitializers_00 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
      (**(local_a30.branches.disposer)->_vptr_ArrayDisposer)
                (local_a30.branches.disposer,pBVar7,0x40,sVar2,sVar2);
    }
    sVar2 = local_a30.text.content.size_;
    pcVar29 = local_a30.text.content.ptr;
    if (local_a30.text.content.ptr != (char *)0x0) {
      local_a30.text.content.ptr = (char *)0x0;
      local_a30.text.content.size_ = 0;
      brandInitializers_00 = (code *)0x0;
      (**(local_a30.text.content.disposer)->_vptr_ArrayDisposer)
                (local_a30.text.content.disposer,pcVar29,1,sVar2,sVar2);
    }
    templateContext_00 = (TemplateContext *)fullName.content.ptr;
    if (fullName.content.size_ == 0) {
      templateContext_00 = (TemplateContext *)0x2214ff;
    }
    pSVar19 = (StringTree *)(fullName.content.size_ + (fullName.content.size_ == 0));
    kj::heapString(&result_2,hexId.currentSize);
    if (hexId.currentSize != 0) {
      pcVar29 = (char *)result_2.content.size_;
      if (result_2.content.size_ != 0) {
        pcVar29 = result_2.content.ptr;
      }
      memcpy(pcVar29,hexId.content,hexId.currentSize);
    }
    local_3b8.content.disposer = (ArrayDisposer *)result_2.content.ptr;
    if (result_2.content.size_ == 0) {
      local_3b8.content.disposer = (ArrayDisposer *)0x2214ff;
    }
    pAStack_3a0 = (ArrayDisposer *)(result_2.content.size_ + (result_2.content.size_ == 0));
    local_f0._16_8_ = brandInitializers.scopes.size_;
    local_d8 = (ArrayDisposer *)brandInitializers.scopes.text.content.ptr;
    pBStack_d0 = (Branch *)brandInitializers.scopes.text.content.size_;
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    local_c8 = brandInitializers.scopes.text.content.disposer;
    pBStack_c0 = brandInitializers.scopes.branches.ptr;
    local_b8 = brandInitializers.scopes.branches.size_;
    pAStack_b0 = brandInitializers.scopes.branches.disposer;
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    local_a8 = brandInitializers.bindings.size_;
    local_a0 = brandInitializers.bindings.text.content.ptr;
    local_98 = brandInitializers.bindings.text.content.size_;
    brandInitializers.bindings.text.content.ptr = (char *)0x0;
    brandInitializers.bindings.text.content.size_ = 0;
    local_90 = brandInitializers.bindings.text.content.disposer;
    pBStack_88 = brandInitializers.bindings.branches.ptr;
    local_80 = brandInitializers.bindings.branches.size_;
    local_78 = brandInitializers.bindings.branches.disposer;
    brandInitializers.bindings.branches.ptr = (Branch *)0x0;
    brandInitializers.bindings.branches.size_ = 0;
    local_70 = brandInitializers.dependencies.size_;
    local_68 = brandInitializers.dependencies.text.content.ptr;
    local_60 = brandInitializers.dependencies.text.content.size_;
    brandInitializers.dependencies.text.content.ptr = (char *)0x0;
    brandInitializers.dependencies.text.content.size_ = 0;
    local_58 = brandInitializers.dependencies.text.content.disposer;
    pBStack_50 = brandInitializers.dependencies.branches.ptr;
    local_48 = brandInitializers.dependencies.branches.size_;
    local_40 = brandInitializers.dependencies.branches.disposer;
    brandInitializers.dependencies.branches.ptr = (Branch *)0x0;
    brandInitializers.dependencies.branches.size_ = 0;
    local_38 = brandInitializers.dependencyCount;
    hexId_00.content.size_ = (size_t)pAStack_3a0;
    hexId_00.content.ptr = (char *)local_3b8.content.disposer;
    fullName_00.content.size_ = (size_t)(local_f0 + 0x10);
    fullName_00.content.ptr = (char *)pSVar19;
    makeGenericDefinitions
              (&local_a30,(CapnpcCppMain *)nestedTypeDecls.size_,templateContext_00,fullName_00,
               hexId_00,(BrandInitializerText *)brandInitializers_00);
    kj::StringTree::concat<kj::StringTree,kj::StringTree>(&local_a78,&defineText,&local_a30,pSVar19)
    ;
    pSVar21 = (StringTree *)defineText.text.content.size_;
    pcVar29 = defineText.text.content.ptr;
    defineText.size_ = local_a78.size_;
    if (defineText.text.content.ptr != (char *)0x0) {
      defineText.text.content.ptr = (char *)0x0;
      defineText.text.content.size_ = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(defineText.text.content.disposer._4_4_,
                           defineText.text.content.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(defineText.text.content.disposer._4_4_,
                          defineText.text.content.disposer._0_4_),pcVar29,1,pSVar21,pSVar21,0);
      pSVar19 = pSVar21;
    }
    pSVar21 = (StringTree *)defineText.branches.size_;
    pBVar7 = defineText.branches.ptr;
    defineText.text.content.ptr = local_a78.text.content.ptr;
    defineText.text.content.size_ = local_a78.text.content.size_;
    defineText.text.content.disposer._0_4_ = local_a78.text.content.disposer._0_4_;
    defineText.text.content.disposer._4_4_ = local_a78.text.content.disposer._4_4_;
    local_a78.text.content.ptr = (char *)0x0;
    local_a78.text.content.size_ = 0;
    if (defineText.branches.ptr != (Branch *)0x0) {
      defineText.branches.ptr = (Branch *)0x0;
      defineText.branches.size_ = 0;
      (**(defineText.branches.disposer)->_vptr_ArrayDisposer)
                (defineText.branches.disposer,pBVar7,0x40,pSVar21,pSVar21,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      pSVar19 = pSVar21;
    }
    pSVar21 = (StringTree *)local_a78.text.content.size_;
    pcVar29 = local_a78.text.content.ptr;
    defineText.branches.ptr = local_a78.branches.ptr;
    defineText.branches.size_ = local_a78.branches.size_;
    defineText.branches.disposer = local_a78.branches.disposer;
    local_a78.branches.ptr = (Branch *)0x0;
    local_a78.branches.size_ = 0;
    if (local_a78.text.content.ptr != (char *)0x0) {
      local_a78.text.content.ptr = (char *)0x0;
      local_a78.text.content.size_ = 0;
      (**(local_a78.text.content.disposer)->_vptr_ArrayDisposer)
                (local_a78.text.content.disposer,pcVar29,1,pSVar21,pSVar21,0);
      pSVar19 = pSVar21;
    }
    pSVar21 = (StringTree *)local_a30.branches.size_;
    pBVar7 = local_a30.branches.ptr;
    if (local_a30.branches.ptr != (Branch *)0x0) {
      local_a30.branches.ptr = (Branch *)0x0;
      local_a30.branches.size_ = 0;
      (**(local_a30.branches.disposer)->_vptr_ArrayDisposer)
                (local_a30.branches.disposer,pBVar7,0x40,pSVar21,pSVar21,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      pSVar19 = pSVar21;
    }
    pSVar21 = (StringTree *)local_a30.text.content.size_;
    pcVar29 = local_a30.text.content.ptr;
    if (local_a30.text.content.ptr != (char *)0x0) {
      local_a30.text.content.ptr = (char *)0x0;
      local_a30.text.content.size_ = 0;
      (**(local_a30.text.content.disposer)->_vptr_ArrayDisposer)
                (local_a30.text.content.disposer,pcVar29,1,pSVar21,pSVar21,0);
      pSVar19 = pSVar21;
    }
    BrandInitializerText::~BrandInitializerText((BrandInitializerText *)(local_f0 + 0x10));
    pSVar21 = (StringTree *)result_2.content.size_;
    pcVar29 = result_2.content.ptr;
    if (result_2.content.ptr != (char *)0x0) {
      result_2.content.ptr = (char *)0x0;
      result_2.content.size_ = 0;
      (**(result_2.content.disposer)->_vptr_ArrayDisposer)
                (result_2.content.disposer,pcVar29,1,pSVar21,pSVar21,0);
      pSVar19 = pSVar21;
    }
    BrandInitializerText::~BrandInitializerText(&brandInitializers);
  }
  local_a78.size_ = 0x222f3d;
  local_a78.text.content.ptr = (char *)0x1d;
  kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (&brandInitializers.scopes,&declareText,&local_a78,(ArrayPtr<const_char> *)pSVar19);
  pAVar23 = (ArrayPtr<const_char> *)declareText.text.content.size_;
  pcVar29 = declareText.text.content.ptr;
  declareText.size_ = brandInitializers.scopes.size_;
  params_1_00 = (ArrayPtr<const_char> *)&declareText.text;
  if (declareText.text.content.ptr != (char *)0x0) {
    declareText.text.content.ptr = (char *)0x0;
    declareText.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(declareText.text.content.disposer._4_4_,
                         declareText.text.content.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(declareText.text.content.disposer._4_4_,
                        declareText.text.content.disposer._0_4_),pcVar29,1,pAVar23,pAVar23,0);
    params_1_00 = pAVar23;
  }
  pAVar23 = (ArrayPtr<const_char> *)declareText.branches.size_;
  pBVar7 = declareText.branches.ptr;
  declareText.text.content.ptr = brandInitializers.scopes.text.content.ptr;
  declareText.text.content.size_ = brandInitializers.scopes.text.content.size_;
  declareText.text.content.disposer._0_4_ = brandInitializers.scopes.text.content.disposer._0_4_;
  declareText.text.content.disposer._4_4_ = brandInitializers.scopes.text.content.disposer._4_4_;
  brandInitializers.scopes.text.content.ptr = (char *)0x0;
  brandInitializers.scopes.text.content.size_ = 0;
  if (declareText.branches.ptr != (Branch *)0x0) {
    declareText.branches.ptr = (Branch *)0x0;
    declareText.branches.size_ = 0;
    (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
              (declareText.branches.disposer,pBVar7,0x40,pAVar23,pAVar23,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    params_1_00 = pAVar23;
  }
  pAVar23 = (ArrayPtr<const_char> *)brandInitializers.scopes.text.content.size_;
  pcVar29 = brandInitializers.scopes.text.content.ptr;
  declareText.branches.ptr = brandInitializers.scopes.branches.ptr;
  declareText.branches.size_ = brandInitializers.scopes.branches.size_;
  declareText.branches.disposer = brandInitializers.scopes.branches.disposer;
  brandInitializers.scopes.branches.ptr = (Branch *)0x0;
  brandInitializers.scopes.branches.size_ = 0;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.text.content.disposer,pcVar29,1,pAVar23,pAVar23,0);
    params_1_00 = pAVar23;
  }
  local_a78.size_ = 0x221772;
  local_a78.text.content.ptr = (char *)0x18;
  kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (&brandInitializers.scopes,&defineText,&local_a78,params_1_00);
  sVar2 = defineText.text.content.size_;
  pcVar29 = defineText.text.content.ptr;
  defineText.size_ = brandInitializers.scopes.size_;
  if (defineText.text.content.ptr != (char *)0x0) {
    defineText.text.content.ptr = (char *)0x0;
    defineText.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(defineText.text.content.disposer._4_4_,
                         defineText.text.content.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(defineText.text.content.disposer._4_4_,
                        defineText.text.content.disposer._0_4_),pcVar29,1,sVar2,sVar2,0);
  }
  sVar2 = defineText.branches.size_;
  pBVar7 = defineText.branches.ptr;
  defineText.text.content.ptr = brandInitializers.scopes.text.content.ptr;
  defineText.text.content.size_ = brandInitializers.scopes.text.content.size_;
  defineText.text.content.disposer._0_4_ = brandInitializers.scopes.text.content.disposer._0_4_;
  defineText.text.content.disposer._4_4_ = brandInitializers.scopes.text.content.disposer._4_4_;
  brandInitializers.scopes.text.content.ptr = (char *)0x0;
  brandInitializers.scopes.text.content.size_ = 0;
  if (defineText.branches.ptr != (Branch *)0x0) {
    defineText.branches.ptr = (Branch *)0x0;
    defineText.branches.size_ = 0;
    (**(defineText.branches.disposer)->_vptr_ArrayDisposer)
              (defineText.branches.disposer,pBVar7,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar2 = brandInitializers.scopes.text.content.size_;
  pcVar29 = brandInitializers.scopes.text.content.ptr;
  defineText.branches.ptr = brandInitializers.scopes.branches.ptr;
  defineText.branches.size_ = brandInitializers.scopes.branches.size_;
  defineText.branches.disposer = brandInitializers.scopes.branches.disposer;
  brandInitializers.scopes.branches.ptr = (Branch *)0x0;
  brandInitializers.scopes.branches.size_ = 0;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.text.content.disposer,pcVar29,1,sVar2,sVar2,0);
  }
  bVar13 = TemplateContext::hasParams((TemplateContext *)nestedTypeDecls.size_);
  local_3d0 = (Branch *)0x2214ff;
  if (bVar13) {
    local_3d0 = (Branch *)0x220bfc;
  }
  suffix_00.content.size_ = 1;
  suffix_00.content.ptr = "";
  TemplateContext::decl(&local_148,(TemplateContext *)nestedTypeDecls.size_,true,suffix_00);
  kj::strTree<char_const*,kj::StringTree,char_const(&)[10],kj::StringPtr&,char_const(&)[3]>
            (&__return_storage_ptr__->outerTypeDecl,(kj *)&local_3d0,(char **)&local_148,
             (StringTree *)"  struct ",(char (*) [10])&name_local,(StringPtr *)0x222114,
             (char (*) [3])in_stack_fffffffffffff578);
  TemplateContext::parentDecls(&local_180,(TemplateContext *)nestedTypeDecls.size_);
  suffix_01.content.size_ = 1;
  suffix_01.content.ptr = "";
  TemplateContext::decl
            (&local_1b8,(TemplateContext *)nestedTypeDecls.size_,scope_local.content.size_ < 2,
             suffix_01);
  result_3.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,(size_t)((nestedTypeDecls.ptr)->text).content.ptr,
                            (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar19 = result_3.ptr;
  if (((nestedTypeDecls.ptr)->text).content.ptr != (char *)0x0) {
    psVar15 = (size_t *)(nestedTypeDecls.ptr)->size_;
    do {
      pcVar29 = (char *)psVar15[1];
      sVar2 = psVar15[2];
      psVar15[1] = 0;
      psVar15[2] = 0;
      sVar4 = psVar15[5];
      pAVar5 = (ArrayDisposer *)psVar15[6];
      pAVar6 = (ArrayDisposer *)psVar15[3];
      pBVar7 = (Branch *)psVar15[4];
      psVar15[4] = 0;
      psVar15[5] = 0;
      pSVar19->size_ = *psVar15;
      (pSVar19->text).content.ptr = pcVar29;
      (pSVar19->text).content.size_ = sVar2;
      (pSVar19->text).content.disposer = pAVar6;
      (pSVar19->branches).ptr = pBVar7;
      (pSVar19->branches).size_ = sVar4;
      (pSVar19->branches).disposer = pAVar5;
      pSVar19 = pSVar19 + 1;
      psVar15 = psVar15 + 7;
    } while (psVar15 !=
             (size_t *)
             ((long)((nestedTypeDecls.ptr)->text).content.ptr * 0x38 + (nestedTypeDecls.ptr)->size_)
            );
  }
  result_3.size_ = ((long)pSVar19 - (long)result_3.ptr >> 3) * 0x6db6db6db6db6db7;
  result_3.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  kj::
  strTree<kj::StringTree,kj::StringTree,char_const(&)[8],kj::StringPtr&,kj::StringPtr&,char_const(&)[4],char_const(&)[3],kj::StringPtr&,char_const(&)[87],kj::Array<kj::StringTree>,char_const(&)[2],kj::StringTree,char_const(&)[6]>
            (&__return_storage_ptr__->outerTypeDef,(kj *)&local_180,&local_1b8,
             (StringTree *)0x221386,(char (*) [8])&scope_local,&name_local,(StringPtr *)0x221eb0,
             (char (*) [4])0x220bfc,(char (*) [3])&name_local,
             (StringPtr *)
             "() = delete;\n\n#if !CAPNP_LITE\n  class Client;\n  class Server;\n#endif  // !CAPNP_LITE\n\n"
             ,(char (*) [87])&result_3,(Array<kj::StringTree> *)0x2214fe,(char (*) [2])&declareText,
             (StringTree *)0x2228ee,(char (*) [6])in_stack_fffffffffffff578);
  TemplateContext::allDecls(&local_1f0,(TemplateContext *)nestedTypeDecls.size_);
  sVar2 = superclasses.size_;
  pacVar31 = (char (*) [9])0x0;
  pSVar21 = (StringTree *)
            kj::_::HeapArrayDisposer::allocateImpl
                      (0x38,0,superclasses.size_,(_func_void_void_ptr *)0x0,
                       (_func_void_void_ptr *)0x0);
  local_9f8 = (StringTree *)(sVar2 * 0x38);
  local_a30.text.content.size_ = (size_t)(pSVar21 + sVar2);
  local_a30.text.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_a38 = (ExtendInfo *)sVar2;
  pSVar19 = pSVar21;
  local_a30.size_ = (size_t)pSVar21;
  if (sVar2 != 0) {
    lVar33 = sVar2 * 0x48;
    pEVar17 = superclasses.ptr;
    do {
      local_a30.text.content.ptr = (char *)pSVar19;
      kj::StringTree::flatten(&result_2,(StringTree *)pEVar17);
      brandInitializers.scopes.size_ = result_2.content.size_ - 1;
      if (result_2.content.size_ == 0) {
        brandInitializers.scopes.size_ = 0;
      }
      brandInitializers.scopes.text.content.ptr = result_2.content.ptr;
      brandInitializers.scopes.text.content.size_ = result_2.content.size_;
      brandInitializers.scopes.text.content.disposer = result_2.content.disposer;
      brandInitializers.scopes.branches.ptr = (Branch *)0x0;
      brandInitializers.scopes.branches.size_ = 0;
      brandInitializers.scopes.branches.disposer = (ArrayDisposer *)0x0;
      kj::strTree<char_const(&)[24],kj::StringTree,char_const(&)[9]>
                (&local_a78,(kj *)",\n      public virtual ",(char (*) [24])&brandInitializers,
                 (StringTree *)0x222fe3,pacVar31);
      pacVar32 = (char (*) [9])brandInitializers.scopes.branches.size_;
      pBVar7 = brandInitializers.scopes.branches.ptr;
      if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
        brandInitializers.scopes.branches.ptr = (Branch *)0x0;
        brandInitializers.scopes.branches.size_ = 0;
        (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
                  (brandInitializers.scopes.branches.disposer,pBVar7,0x40,pacVar32,pacVar32,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
        pacVar31 = pacVar32;
      }
      pacVar32 = (char (*) [9])brandInitializers.scopes.text.content.size_;
      pcVar29 = brandInitializers.scopes.text.content.ptr;
      if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
        brandInitializers.scopes.text.content.ptr = (char *)0x0;
        brandInitializers.scopes.text.content.size_ = 0;
        (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
                  (brandInitializers.scopes.text.content.disposer,pcVar29,1,pacVar32,pacVar32,0);
        pacVar31 = pacVar32;
      }
      pSVar19->size_ = local_a78.size_;
      (pSVar19->text).content.ptr = local_a78.text.content.ptr;
      (pSVar19->text).content.size_ = local_a78.text.content.size_;
      local_a78.text.content.ptr = (char *)0x0;
      local_a78.text.content.size_ = 0;
      (pSVar19->text).content.disposer = local_a78.text.content.disposer;
      (pSVar19->branches).ptr = local_a78.branches.ptr;
      (pSVar19->branches).size_ = local_a78.branches.size_;
      (pSVar19->branches).disposer = local_a78.branches.disposer;
      pSVar19 = pSVar19 + 1;
      pEVar17 = pEVar17 + 1;
      lVar33 = lVar33 + -0x48;
    } while (lVar33 != 0);
  }
  result_4.size_ = ((long)pSVar19 - (long)pSVar21 >> 3) * 0x6db6db6db6db6db7;
  result_4.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_468 = 0;
  uStack_460 = 0;
  local_458 = (undefined8 *)0x0;
  type.content.size_ = (size_t)&local_468;
  type.content.ptr = (char *)name_local.content.size_;
  local_a30.text.content.ptr = (char *)pSVar19;
  result_4.ptr = pSVar21;
  makeAsGenericDef(&local_228,(CapnpcCppMain *)((long)&puRam0000000000000000 + 2),
                   (AsGenericRole)nestedTypeDecls.size_,(TemplateContext *)name_local.content.ptr,
                   type,(String *)in_stack_fffffffffffff578);
  result_5.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar16,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar19 = result_5.ptr;
  if (sVar16 != 0) {
    pEVar17 = firstElement;
    do {
      pcVar29 = *(char **)((long)pEVar17 + 8);
      sVar2 = *(size_t *)((long)pEVar17 + 0x10);
      *(size_t *)((long)pEVar17 + 8) = 0;
      *(size_t *)((long)pEVar17 + 0x10) = 0;
      sVar4 = *(size_t *)((long)pEVar17 + 0x28);
      pAVar5 = *(ArrayDisposer **)((long)pEVar17 + 0x30);
      pAVar6 = *(ArrayDisposer **)((long)pEVar17 + 0x18);
      pBVar7 = *(Branch **)((long)pEVar17 + 0x20);
      *(size_t *)((long)pEVar17 + 0x20) = 0;
      *(size_t *)((long)pEVar17 + 0x28) = 0;
      pSVar19->size_ = *(size_t *)pEVar17;
      (pSVar19->text).content.ptr = pcVar29;
      (pSVar19->text).content.size_ = sVar2;
      (pSVar19->text).content.disposer = pAVar6;
      (pSVar19->branches).ptr = pBVar7;
      (pSVar19->branches).size_ = sVar4;
      (pSVar19->branches).disposer = pAVar5;
      pSVar19 = pSVar19 + 1;
      pEVar17 = (ExtendInfo *)((long)pEVar17 + 0x118);
    } while (pEVar17 != (ExtendInfo *)((long)firstElement + lVar24 * 8));
  }
  result_5.size_ = ((long)pSVar19 - (long)result_5.ptr >> 3) * 0x6db6db6db6db6db7;
  result_5.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  TemplateContext::allDecls(&local_260,(TemplateContext *)nestedTypeDecls.size_);
  pEVar17 = local_a38;
  pacVar31 = (char (*) [9])0x0;
  pSVar19 = (StringTree *)
            kj::_::HeapArrayDisposer::allocateImpl
                      (0x38,0,(size_t)local_a38,(_func_void_void_ptr *)0x0,
                       (_func_void_void_ptr *)0x0);
  local_a30.text.content.size_ = (long)&pSVar19->size_ + (long)local_9f8;
  local_a30.text.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_a30.size_ = (size_t)pSVar19;
  local_9f8 = pSVar19;
  if (pEVar17 != (ExtendInfo *)0x0) {
    lVar33 = (long)pEVar17 * 0x48;
    pEVar17 = superclasses.ptr;
    do {
      local_a30.text.content.ptr = (char *)pSVar19;
      kj::StringTree::flatten(&result_2,(StringTree *)pEVar17);
      brandInitializers.scopes.size_ = result_2.content.size_ - 1;
      if (result_2.content.size_ == 0) {
        brandInitializers.scopes.size_ = 0;
      }
      brandInitializers.scopes.text.content.ptr = result_2.content.ptr;
      brandInitializers.scopes.text.content.size_ = result_2.content.size_;
      brandInitializers.scopes.text.content.disposer = result_2.content.disposer;
      brandInitializers.scopes.branches.ptr = (Branch *)0x0;
      brandInitializers.scopes.branches.size_ = 0;
      brandInitializers.scopes.branches.disposer = (ArrayDisposer *)0x0;
      kj::strTree<char_const(&)[24],kj::StringTree,char_const(&)[9]>
                (&local_a78,(kj *)",\n      public virtual ",(char (*) [24])&brandInitializers,
                 (StringTree *)0x22325c,pacVar31);
      pacVar32 = (char (*) [9])brandInitializers.scopes.branches.size_;
      pBVar7 = brandInitializers.scopes.branches.ptr;
      if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
        brandInitializers.scopes.branches.ptr = (Branch *)0x0;
        brandInitializers.scopes.branches.size_ = 0;
        (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
                  (brandInitializers.scopes.branches.disposer,pBVar7,0x40,pacVar32,pacVar32,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
        pacVar31 = pacVar32;
      }
      pacVar32 = (char (*) [9])brandInitializers.scopes.text.content.size_;
      pcVar29 = brandInitializers.scopes.text.content.ptr;
      if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
        brandInitializers.scopes.text.content.ptr = (char *)0x0;
        brandInitializers.scopes.text.content.size_ = 0;
        (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
                  (brandInitializers.scopes.text.content.disposer,pcVar29,1,pacVar32,pacVar32,0);
        pacVar31 = pacVar32;
      }
      pSVar19->size_ = local_a78.size_;
      (pSVar19->text).content.ptr = local_a78.text.content.ptr;
      (pSVar19->text).content.size_ = local_a78.text.content.size_;
      local_a78.text.content.ptr = (char *)0x0;
      local_a78.text.content.size_ = 0;
      (pSVar19->text).content.disposer = local_a78.text.content.disposer;
      (pSVar19->branches).ptr = local_a78.branches.ptr;
      (pSVar19->branches).size_ = local_a78.branches.size_;
      (pSVar19->branches).disposer = local_a78.branches.disposer;
      pSVar19 = pSVar19 + 1;
      pEVar17 = pEVar17 + 1;
      lVar33 = lVar33 + -0x48;
    } while (lVar33 != 0);
  }
  result_6.size_ = ((long)pSVar19 - (long)local_9f8 >> 3) * 0x6db6db6db6db6db7;
  result_6.ptr = local_9f8;
  result_6.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_a30.text.content.ptr = (char *)pSVar19;
  result_7.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar16,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar19 = result_7.ptr;
  if (sVar16 != 0) {
    lVar33 = 0;
    do {
      psVar15 = (size_t *)((long)firstElement + lVar33 + 0x38);
      sVar4 = *psVar15;
      pcVar29 = (char *)psVar15[1];
      sVar2 = *(size_t *)((long)firstElement + lVar33 + 0x48);
      puVar1 = (undefined8 *)((long)firstElement + lVar33 + 0x40);
      *puVar1 = 0;
      puVar1[1] = 0;
      psVar15 = (size_t *)((long)firstElement + lVar33 + 0x60);
      sVar8 = *psVar15;
      pAVar5 = (ArrayDisposer *)psVar15[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar33 + 0x50);
      pAVar6 = (ArrayDisposer *)*puVar1;
      pBVar7 = (Branch *)puVar1[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar33 + 0x58);
      *puVar1 = 0;
      puVar1[1] = 0;
      pSVar19->size_ = sVar4;
      (pSVar19->text).content.ptr = pcVar29;
      (pSVar19->text).content.size_ = sVar2;
      (pSVar19->text).content.disposer = pAVar6;
      (pSVar19->branches).ptr = pBVar7;
      (pSVar19->branches).size_ = sVar8;
      (pSVar19->branches).disposer = pAVar5;
      pSVar19 = pSVar19 + 1;
      lVar33 = lVar33 + 0x118;
    } while (lVar24 * 8 - lVar33 != 0);
  }
  result_7.size_ = ((long)pSVar19 - (long)result_7.ptr >> 3) * 0x6db6db6db6db6db7;
  result_7.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_298.size_ = 0x220c7c;
  local_298.text.content.ptr = (char *)0x10;
  local_2d0.size_ = 0x22118c;
  local_2d0.text.content.ptr = (char *)((long)&puRam0000000000000000 + 6);
  local_308.text.content.ptr = (char *)0x0;
  if (fullName.content.size_ != 0) {
    local_308.text.content.ptr = (char *)(fullName.content.size_ - 1);
  }
  local_528.size_ = 0x222fb2;
  local_528.text.content.ptr = (char *)0x39;
  delim.content.size_ = 1;
  delim.content.ptr = "";
  kj::StringTree::StringTree(&brandInitializers.scopes,&result_4,delim);
  result_11.ptr = (StringTree *)0x222cfd;
  result_11.size_ = 0x15;
  local_690 = name_local.content.size_ - 1;
  local_698 = (Branch *)name_local.content.ptr;
  local_3f0 = (undefined1  [8])0x222fec;
  local_3e8 = (char *)0x12;
  local_6f0.content.size_ = name_local.content.size_ - 1;
  local_6f0.content.ptr = name_local.content.ptr;
  result_8.ptr = (StringTree *)anon_var_dwarf_82494;
  result_8.size_ = 0x204;
  delim_00.content.size_ = 1;
  delim_00.content.ptr = "";
  kj::StringTree::StringTree(&local_a78,&result_5,delim_00);
  result_9.ptr = (StringTree *)anon_var_dwarf_824ad;
  result_9.size_ = 0x26;
  result_10.ptr = (StringTree *)0x22118c;
  result_10.size_ = 6;
  local_560 = (ArrayDisposer *)0x0;
  if (fullName.content.size_ != 0) {
    local_560 = (ArrayDisposer *)(fullName.content.size_ - 1);
  }
  local_578._0_8_ = "::Server\n    : public virtual ::capnp::Capability::Server";
  local_578._8_8_ = (ArrayDisposer *)0x39;
  delim_01.content.size_ = 1;
  delim_01.content.ptr = "";
  kj::StringTree::StringTree(&local_a30,&result_6,delim_01);
  local_588._0_8_ = " {\npublic:\n";
  local_588._8_8_ = (char *)0xb;
  local_5a8._16_8_ = "  typedef ";
  local_590 = (ArrayDisposer *)0xa;
  local_5a8._8_8_ = name_local.content.size_ - 1;
  local_5a8._0_8_ = name_local.content.ptr;
  local_5c8._16_8_ =
       " Serves;\n\n  ::kj::Promise<void> dispatchCall(uint64_t interfaceId, uint16_t methodId,\n      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context)\n      override;\n\nprotected:\n"
  ;
  local_5b0 = (CppTypeName *)0xc1;
  delim_02.content.size_ = 1;
  delim_02.content.ptr = "";
  kj::StringTree::StringTree((StringTree *)&result_2,&result_7,delim_02);
  local_5c8._0_8_ = "\n  inline ";
  local_5c8._8_8_ = (ArrayDisposer *)0xa;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_4a8,(kj *)&map,value);
  local_5d8._0_8_ =
       " thisCap() {\n    return ::capnp::Capability::Server::thisCap()\n        .template castAs<";
  local_5d8._8_8_ = (char *)0x58;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_4e8,(kj *)&typeName,value_00);
  local_3b8.content.ptr =
       ">();\n  }\n\n  ::kj::Promise<void> dispatchCallInternal(uint16_t methodId,\n      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context);\n};\n#endif  // !CAPNP_LITE\n\n"
  ;
  local_3b8.content.size_ = 0xb3;
  kj::StringTree::
  concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
            (&__return_storage_ptr__->clientServerDefs,&local_298,(ArrayPtr<const_char> *)&local_1f0
             ,&local_2d0,(ArrayPtr<const_char> *)&local_308,(ArrayPtr<const_char> *)&local_528,
             (ArrayPtr<const_char> *)&brandInitializers,(StringTree *)&result_11,
             (ArrayPtr<const_char> *)&stack0xfffffffffffff968,(ArrayPtr<const_char> *)local_3f0,
             (ArrayPtr<const_char> *)&local_6f0,(ArrayPtr<const_char> *)&result_8,
             (ArrayPtr<const_char> *)&local_228,&local_a78,(StringTree *)&result_9,
             (ArrayPtr<const_char> *)&local_260,(StringTree *)&result_10,
             (ArrayPtr<const_char> *)(local_578 + 0x10),(ArrayPtr<const_char> *)local_578,
             (ArrayPtr<const_char> *)&local_a30,(StringTree *)local_588,
             (ArrayPtr<const_char> *)(local_5a8 + 0x10),(ArrayPtr<const_char> *)local_5a8,
             (ArrayPtr<const_char> *)(local_5c8 + 0x10),(ArrayPtr<const_char> *)&result_2,
             (StringTree *)local_5c8,(ArrayPtr<const_char> *)&local_4a8,(String *)local_5d8,
             (ArrayPtr<const_char> *)&local_4e8,&local_3b8,
             (ArrayPtr<const_char> *)in_stack_fffffffffffff578);
  pcVar29 = local_4e8.text.content.ptr;
  sVar2 = local_4e8.size_;
  if (local_4e8.size_ != 0) {
    local_4e8.size_ = 0;
    local_4e8.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_4e8.text.content.size_)
              (local_4e8.text.content.size_,sVar2,1,pcVar29,pcVar29,0);
  }
  pcVar29 = local_4a8.text.content.ptr;
  sVar2 = local_4a8.size_;
  if (local_4a8.size_ != 0) {
    local_4a8.size_ = 0;
    local_4a8.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_4a8.text.content.size_)
              (local_4a8.text.content.size_,sVar2,1,pcVar29,pcVar29,0);
  }
  if (local_888 != (Branch *)0x0) {
    local_888 = (Branch *)0x0;
    sStack_880 = 0;
    (**local_878->_vptr_ArrayDisposer)
              (local_878,pBVar11,0x40,sVar3,sVar3,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pAVar5 = result_2.content.disposer;
  sVar3 = result_2.content.size_;
  if (result_2.content.size_ != 0) {
    result_2.content.size_ = 0;
    result_2.content.disposer = (ArrayDisposer *)0x0;
    (**local_890->_vptr_ArrayDisposer)(local_890,sVar3,1,pAVar5,pAVar5,0);
  }
  sVar3 = local_a30.branches.size_;
  pBVar7 = local_a30.branches.ptr;
  if (local_a30.branches.ptr != (Branch *)0x0) {
    local_a30.branches.ptr = (Branch *)0x0;
    local_a30.branches.size_ = 0;
    (**(local_a30.branches.disposer)->_vptr_ArrayDisposer)
              (local_a30.branches.disposer,pBVar7,0x40,sVar3,sVar3,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar3 = local_a30.text.content.size_;
  pcVar29 = local_a30.text.content.ptr;
  if ((StringTree *)local_a30.text.content.ptr != (StringTree *)0x0) {
    local_a30.text.content.ptr = (char *)0x0;
    local_a30.text.content.size_ = 0;
    (**(local_a30.text.content.disposer)->_vptr_ArrayDisposer)
              (local_a30.text.content.disposer,pcVar29,1,sVar3,sVar3,0);
  }
  sVar3 = local_a78.branches.size_;
  pBVar7 = local_a78.branches.ptr;
  if (local_a78.branches.ptr != (Branch *)0x0) {
    local_a78.branches.ptr = (Branch *)0x0;
    local_a78.branches.size_ = 0;
    (**(local_a78.branches.disposer)->_vptr_ArrayDisposer)
              (local_a78.branches.disposer,pBVar7,0x40,sVar3,sVar3,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar3 = local_a78.text.content.size_;
  pcVar29 = local_a78.text.content.ptr;
  if (local_a78.text.content.ptr != (char *)0x0) {
    local_a78.text.content.ptr = (char *)0x0;
    local_a78.text.content.size_ = 0;
    (**(local_a78.text.content.disposer)->_vptr_ArrayDisposer)
              (local_a78.text.content.disposer,pcVar29,1,sVar3,sVar3,0);
  }
  sVar3 = brandInitializers.scopes.branches.size_;
  pBVar7 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.branches.disposer,pBVar7,0x40,sVar3,sVar3,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar3 = brandInitializers.scopes.text.content.size_;
  pcVar29 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.text.content.disposer,pcVar29,1,sVar3,sVar3,0);
  }
  TemplateContext::allDecls(&local_a30,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls((StringTree *)&result_2,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls(&local_4a8,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls(&local_4e8,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls(&local_298,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls(&local_2d0,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls(&local_308,(TemplateContext *)nestedTypeDecls.size_);
  result_8.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar16,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar19 = result_8.ptr;
  if (sVar16 != 0) {
    lVar33 = 0;
    do {
      psVar15 = (size_t *)((long)firstElement + lVar33 + 0x70);
      sVar2 = *psVar15;
      pcVar29 = (char *)psVar15[1];
      sVar3 = *(size_t *)((long)firstElement + lVar33 + 0x80);
      puVar1 = (undefined8 *)((long)firstElement + lVar33 + 0x78);
      *puVar1 = 0;
      puVar1[1] = 0;
      psVar15 = (size_t *)((long)firstElement + lVar33 + 0x98);
      sVar4 = *psVar15;
      pAVar5 = (ArrayDisposer *)psVar15[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar33 + 0x88);
      pAVar6 = (ArrayDisposer *)*puVar1;
      pBVar7 = (Branch *)puVar1[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar33 + 0x90);
      *puVar1 = 0;
      puVar1[1] = 0;
      pSVar19->size_ = sVar2;
      (pSVar19->text).content.ptr = pcVar29;
      (pSVar19->text).content.size_ = sVar3;
      (pSVar19->text).content.disposer = pAVar6;
      (pSVar19->branches).ptr = pBVar7;
      (pSVar19->branches).size_ = sVar4;
      (pSVar19->branches).disposer = pAVar5;
      pSVar19 = pSVar19 + 1;
      lVar33 = lVar33 + 0x118;
    } while (lVar24 * 8 - lVar33 != 0);
  }
  result_8.size_ = ((long)pSVar19 - (long)result_8.ptr >> 3) * 0x6db6db6db6db6db7;
  result_8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  result_11.ptr = (StringTree *)0x220c7c;
  result_11.size_ = 0x10;
  local_690 = 7;
  local_698 = (Branch *)"inline ";
  result_10.size_ = (size_t)(CppTypeName *)0x0;
  if (fullName.content.size_ != 0) {
    result_10.size_ = (size_t)(fullName.content.size_ - 1);
  }
  local_6f0.content.size_ = 0x52;
  local_6f0.content.ptr =
       "::Client::Client(decltype(nullptr))\n    : ::capnp::Capability::Client(nullptr) {}\n";
  result_9.ptr = (StringTree *)0x223528;
  result_9.size_ = 7;
  local_578._16_8_ =
       "::Client::Client(\n    ::kj::Own< ::capnp::ClientHook>&& hook)\n    : ::capnp::Capability::Client(::kj::mv(hook)) {}\n"
  ;
  local_560 = (ArrayDisposer *)0x73;
  local_578._0_8_ = "template <typename _t, typename>\ninline ";
  local_578._8_8_ = &DAT_00000028;
  local_5a8._16_8_ =
       "::Client::Client(::kj::Own<_t>&& server)\n    : ::capnp::Capability::Client(::kj::mv(server)) {}\n"
  ;
  local_590 = (ArrayDisposer *)0x60;
  local_5a8._0_8_ = "template <typename _t, typename>\ninline ";
  local_5a8._8_8_ = &DAT_00000028;
  local_5c8._0_8_ =
       "::Client::Client(::kj::Promise<_t>&& promise)\n    : ::capnp::Capability::Client(::kj::mv(promise)) {}\n"
  ;
  local_5c8._8_8_ = (ArrayDisposer *)0x66;
  local_5d8._0_8_ = "inline ";
  local_5d8._8_8_ = (long)&puRam0000000000000000 + 7;
  local_318.ptr =
       "::Client::Client(::kj::Exception&& exception)\n    : ::capnp::Capability::Client(::kj::mv(exception)) {}\n"
  ;
  local_318.size_ = 0x68;
  local_338._16_8_ = "inline ";
  local_320 = (long)&puRam0000000000000000 + 7;
  local_5b0 = (CppTypeName *)result_10.size_;
  local_588._8_8_ = result_10.size_;
  local_3e8 = (char *)result_10.size_;
  local_3b8.content.size_ = result_10.size_;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_a78,(kj *)&map,(CppTypeName *)result_10.size_);
  local_338._0_8_ = "& ";
  local_338._8_8_ = 2;
  local_348.size_ = (size_t)(CppTypeName *)0x0;
  if (fullName.content.size_ != 0) {
    local_348.size_ = (size_t)(fullName.content.size_ - 1);
  }
  local_358.ptr =
       "::Client::operator=(Client& other) {\n  ::capnp::Capability::Client::operator=(other);\n  return *this;\n}\n"
  ;
  local_358.size_ = 0x68;
  local_378._16_8_ = "inline ";
  local_360 = (long)&puRam0000000000000000 + 7;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_528,(kj *)&map,(CppTypeName *)local_348.size_);
  local_378._0_8_ = "& ";
  local_378._8_8_ = 2;
  local_388.size_ = 0;
  if (fullName.content.size_ != 0) {
    local_388.size_ = fullName.content.size_ - 1;
  }
  local_398.ptr =
       "::Client::operator=(Client&& other) {\n  ::capnp::Capability::Client::operator=(kj::mv(other));\n  return *this;\n}\n\n"
  ;
  local_398.size_ = 0x72;
  delim_03.content.size_ = 1;
  delim_03.content.ptr = "";
  kj::StringTree::StringTree(&brandInitializers.scopes,&result_8,delim_03);
  local_f0._0_8_ = "#endif  // !CAPNP_LITE\n";
  local_f0._8_8_ = (char *)0x17;
  kj::StringTree::
  concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (&__return_storage_ptr__->inlineMethodDefs,(StringTree *)&result_11,
             (ArrayPtr<const_char> *)&local_a30,(StringTree *)&stack0xfffffffffffff968,
             (ArrayPtr<const_char> *)local_3f0,(ArrayPtr<const_char> *)&local_6f0,
             (ArrayPtr<const_char> *)&result_2,(StringTree *)&result_9,
             (ArrayPtr<const_char> *)&result_10,(ArrayPtr<const_char> *)(local_578 + 0x10),
             (ArrayPtr<const_char> *)&local_4a8,(StringTree *)local_578,
             (ArrayPtr<const_char> *)local_588,(ArrayPtr<const_char> *)(local_5a8 + 0x10),
             (ArrayPtr<const_char> *)&local_4e8,(StringTree *)local_5a8,
             (ArrayPtr<const_char> *)(local_5c8 + 0x10),(ArrayPtr<const_char> *)local_5c8,
             (ArrayPtr<const_char> *)&local_298,(StringTree *)local_5d8,
             (ArrayPtr<const_char> *)&local_3b8,&local_318,(ArrayPtr<const_char> *)&local_2d0,
             (StringTree *)(local_338 + 0x10),(ArrayPtr<const_char> *)&local_a78,(String *)local_338
             ,&local_348,&local_358,(ArrayPtr<const_char> *)&local_308,
             (StringTree *)(local_378 + 0x10),(ArrayPtr<const_char> *)&local_528,(String *)local_378
             ,&local_388,&local_398,(ArrayPtr<const_char> *)&brandInitializers,
             (StringTree *)local_f0,(ArrayPtr<const_char> *)in_stack_fffffffffffff578);
  sVar3 = brandInitializers.scopes.branches.size_;
  pBVar7 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.branches.disposer,pBVar7,0x40,sVar3,sVar3,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar3 = brandInitializers.scopes.text.content.size_;
  pcVar29 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
              (brandInitializers.scopes.text.content.disposer,pcVar29,1,sVar3,sVar3,0);
  }
  pcVar29 = local_528.text.content.ptr;
  sVar3 = local_528.size_;
  if ((char *)local_528.size_ != (char *)0x0) {
    local_528.size_ = 0;
    local_528.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_528.text.content.size_)
              (local_528.text.content.size_,sVar3,1,pcVar29,pcVar29,0);
  }
  pcVar29 = local_a78.text.content.ptr;
  sVar3 = local_a78.size_;
  if ((char *)local_a78.size_ != (char *)0x0) {
    local_a78.size_ = 0;
    local_a78.text.content.ptr = (char *)0x0;
    (**(code **)*(size_t *)local_a78.text.content.size_)
              (local_a78.text.content.size_,sVar3,1,pcVar29,pcVar29,0);
  }
  result_9.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar16,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar19 = result_9.ptr;
  if (sVar16 != 0) {
    lVar33 = 0;
    do {
      psVar15 = (size_t *)((long)firstElement + lVar33 + 0xa8);
      sVar2 = *psVar15;
      pcVar29 = (char *)psVar15[1];
      sVar3 = *(size_t *)((long)firstElement + lVar33 + 0xb8);
      puVar1 = (undefined8 *)((long)firstElement + lVar33 + 0xb0);
      *puVar1 = 0;
      puVar1[1] = 0;
      psVar15 = (size_t *)((long)firstElement + lVar33 + 0xd0);
      sVar4 = *psVar15;
      pAVar5 = (ArrayDisposer *)psVar15[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar33 + 0xc0);
      pAVar6 = (ArrayDisposer *)*puVar1;
      pBVar7 = (Branch *)puVar1[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar33 + 200);
      *puVar1 = 0;
      puVar1[1] = 0;
      pSVar19->size_ = sVar2;
      (pSVar19->text).content.ptr = pcVar29;
      (pSVar19->text).content.size_ = sVar3;
      (pSVar19->text).content.disposer = pAVar6;
      (pSVar19->branches).ptr = pBVar7;
      (pSVar19->branches).size_ = sVar4;
      (pSVar19->branches).disposer = pAVar5;
      pSVar19 = pSVar19 + 1;
      lVar33 = lVar33 + 0x118;
    } while (lVar24 * 8 - lVar33 != 0);
  }
  result_9.size_ = ((long)pSVar19 - (long)result_9.ptr >> 3) * 0x6db6db6db6db6db7;
  result_9.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  TemplateContext::allDecls(&local_528,(TemplateContext *)nestedTypeDecls.size_);
  if (proto._reader.dataSize < 0x40) {
    uVar28 = 0;
  }
  else {
    uVar28 = *proto._reader.data;
  }
  kj::hex((CappedArray<char,_17UL> *)local_3f0,uVar28);
  pSVar19 = (StringTree *)
            kj::_::HeapArrayDisposer::allocateImpl
                      (0x38,0,(size_t)pcVar27,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
  ;
  local_690 = (size_t)pSVar19;
  local_698 = (Branch *)pSVar19;
  local_688 = (ArrayDisposer *)(lVar26 * 0x1c71c71c71c71c78 + (long)pSVar19);
  local_680 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_a38 = (ExtendInfo *)pSVar19;
  local_9f8 = (StringTree *)pcVar27;
  if (pcVar27 != (char *)0x0) {
    lVar26 = lVar26 * 8;
    pSVar21 = (StringTree *)sVar9;
    do {
      kj::hex((CappedArray<char,_17UL> *)&result_11,(unsigned_long)pSVar21[1].text.content.ptr);
      kj::StringTree::flatten(&local_6f0,pSVar21);
      brandInitializers.scopes.size_ = local_6f0.content.size_ - 1;
      if (local_6f0.content.size_ == 0) {
        brandInitializers.scopes.size_ = 0;
      }
      brandInitializers.scopes.text.content.ptr = local_6f0.content.ptr;
      brandInitializers.scopes.text.content.size_ = local_6f0.content.size_;
      brandInitializers.scopes.text.content.disposer = local_6f0.content.disposer;
      brandInitializers.scopes.branches.ptr = (Branch *)0x0;
      brandInitializers.scopes.branches.size_ = 0;
      brandInitializers.scopes.branches.disposer = (ArrayDisposer *)0x0;
      kj::
      strTree<char_const(&)[12],kj::CappedArray<char,17ul>,char_const(&)[19],kj::StringTree,char_const(&)[52]>
                (&local_a78,(kj *)0x2237ed,(char (*) [12])&result_11,
                 (CappedArray<char,_17UL> *)"ull:\n      return ",(char (*) [19])&brandInitializers,
                 (StringTree *)"::Server::dispatchCallInternal(methodId, context);\n",
                 (char (*) [52])in_stack_fffffffffffff578);
      sVar3 = brandInitializers.scopes.branches.size_;
      pBVar7 = brandInitializers.scopes.branches.ptr;
      if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
        brandInitializers.scopes.branches.ptr = (Branch *)0x0;
        brandInitializers.scopes.branches.size_ = 0;
        (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
                  (brandInitializers.scopes.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      sVar3 = brandInitializers.scopes.text.content.size_;
      pcVar27 = brandInitializers.scopes.text.content.ptr;
      if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
        brandInitializers.scopes.text.content.ptr = (char *)0x0;
        brandInitializers.scopes.text.content.size_ = 0;
        (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
                  (brandInitializers.scopes.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
      }
      pSVar19->size_ = local_a78.size_;
      (pSVar19->text).content.ptr = local_a78.text.content.ptr;
      (pSVar19->text).content.size_ = local_a78.text.content.size_;
      local_a78.text.content.ptr = (char *)0x0;
      local_a78.text.content.size_ = 0;
      (pSVar19->text).content.disposer = local_a78.text.content.disposer;
      (pSVar19->branches).ptr = local_a78.branches.ptr;
      (pSVar19->branches).size_ = local_a78.branches.size_;
      (pSVar19->branches).disposer = local_a78.branches.disposer;
      pSVar19 = pSVar19 + 1;
      local_690 = (size_t)pSVar19;
      pSVar21 = (StringTree *)&pSVar21[1].text.content.size_;
      lVar26 = lVar26 + -0x48;
    } while (lVar26 != 0);
  }
  result_10.size_ = ((long)pSVar19 - (long)local_a38 >> 3) * 0x6db6db6db6db6db7;
  result_10.ptr = (StringTree *)local_a38;
  result_10.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  bVar13 = proto._reader.pointerCount == 0;
  brandInitializers.scopes.text.content.size_ = (size_t)proto._reader.pointers;
  if (bVar13) {
    brandInitializers.scopes.text.content.size_ = (size_t)(WirePointer *)0x0;
  }
  iVar14 = 0x7fffffff;
  if (!bVar13) {
    iVar14 = proto._reader.nestingLimit;
  }
  uVar34 = 0;
  uVar35 = 0;
  uVar36 = 0;
  uVar37 = 0;
  if (!bVar13) {
    uVar34 = proto._reader.segment._0_4_;
    uVar35 = proto._reader.segment._4_4_;
    uVar36 = proto._reader.capTable._0_4_;
    uVar37 = proto._reader.capTable._4_4_;
  }
  brandInitializers.scopes.size_ = CONCAT44(uVar35,uVar34);
  brandInitializers.scopes.text.content.ptr = (char *)CONCAT44(uVar37,uVar36);
  brandInitializers.scopes.text.content.disposer =
       (ArrayDisposer *)CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,iVar14);
  _local_698 = (ArrayPtr<const_char>)
               _::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&brandInitializers,(void *)0x0,0);
  TemplateContext::allDecls(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_);
  result_11.ptr =
       (StringTree *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x38,0,sVar16,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar19 = result_11.ptr;
  if (sVar16 != 0) {
    lVar26 = 0;
    do {
      psVar15 = (size_t *)((long)firstElement + lVar26 + 0xe0);
      sVar2 = *psVar15;
      pcVar27 = (char *)psVar15[1];
      sVar3 = *(size_t *)((long)firstElement + lVar26 + 0xf0);
      puVar1 = (undefined8 *)((long)firstElement + lVar26 + 0xe8);
      *puVar1 = 0;
      puVar1[1] = 0;
      psVar15 = (size_t *)((long)firstElement + lVar26 + 0x108);
      sVar4 = *psVar15;
      pAVar5 = (ArrayDisposer *)psVar15[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar26 + 0xf8);
      pAVar6 = (ArrayDisposer *)*puVar1;
      pBVar7 = (Branch *)puVar1[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar26 + 0x100);
      *puVar1 = 0;
      puVar1[1] = 0;
      pSVar19->size_ = sVar2;
      (pSVar19->text).content.ptr = pcVar27;
      (pSVar19->text).content.size_ = sVar3;
      (pSVar19->text).content.disposer = pAVar6;
      (pSVar19->branches).ptr = pBVar7;
      (pSVar19->branches).size_ = sVar4;
      (pSVar19->branches).disposer = pAVar5;
      pSVar19 = pSVar19 + 1;
      lVar26 = lVar26 + 0x118;
    } while (lVar24 * 8 - lVar26 != 0);
  }
  result_11.size_ = ((long)pSVar19 - (long)result_11.ptr >> 3) * 0x6db6db6db6db6db7;
  result_11.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  bVar13 = proto._reader.pointerCount == 0;
  local_a78.text.content.size_ = (size_t)proto._reader.pointers;
  if (bVar13) {
    local_a78.text.content.size_ = (size_t)(WirePointer *)0x0;
  }
  iVar14 = 0x7fffffff;
  if (!bVar13) {
    iVar14 = proto._reader.nestingLimit;
  }
  uVar34 = 0;
  uVar35 = 0;
  uVar36 = 0;
  uVar37 = 0;
  if (!bVar13) {
    uVar34 = proto._reader.segment._0_4_;
    uVar35 = proto._reader.segment._4_4_;
    uVar36 = proto._reader.capTable._0_4_;
    uVar37 = proto._reader.capTable._4_4_;
  }
  local_a78.size_ = CONCAT44(uVar35,uVar34);
  local_a78.text.content.ptr = (char *)CONCAT44(uVar37,uVar36);
  local_a78.text.content.disposer =
       (ArrayDisposer *)CONCAT44(local_a78.text.content.disposer._4_4_,iVar14);
  local_6f0.content._0_16_ =
       _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_a78,(void *)0x0,0);
  if (proto._reader.dataSize < 0x40) {
    uVar28 = 0;
  }
  else {
    uVar28 = *proto._reader.data;
  }
  kj::hex((CappedArray<char,_17UL> *)&local_a78,uVar28);
  pIVar22 = (InterfaceText *)
            kj::
            strTree<char_const(&)[17],kj::Array<kj::StringTree>,kj::StringTree,char_const(&)[21],kj::String&,char_const(&)[185],kj::CappedArray<char,17ul>,char_const(&)[60],kj::Array<kj::StringTree>,char_const(&)[50],capnp::Text::Reader,char_const(&)[24],kj::StringTree,char_const(&)[21],kj::String&,char_const(&)[157],kj::Array<kj::StringTree>,char_const(&)[111],capnp::Text::Reader,char_const(&)[16],kj::CappedArray<char,17ul>,char_const(&)[47],kj::StringTree>
                      (&__return_storage_ptr__->sourceDefs,(kj *)0x220c7c,(char (*) [17])&result_9,
                       (Array<kj::StringTree> *)&local_528,(StringTree *)0x223af6,
                       (char (*) [21])&fullName,
                       (String *)
                       "::Server::dispatchCall(\n    uint64_t interfaceId, uint16_t methodId,\n    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n  switch (interfaceId) {\n    case 0x"
                       ,(char (*) [185])local_3f0,
                       (CappedArray<char,_17UL> *)
                       "ull:\n      return dispatchCallInternal(methodId, context);\n",
                       (char (*) [60])&result_10,
                       (Array<kj::StringTree> *)
                       "    default:\n      return internalUnimplemented(\"",
                       (char (*) [50])&stack0xfffffffffffff968,
                       (Reader *)"\", interfaceId);\n  }\n}\n",(char (*) [24])&brandInitializers,
                       (StringTree *)0x223af6,(char (*) [21])&fullName,
                       (String *)
                       "::Server::dispatchCallInternal(\n    uint16_t methodId,\n    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n  switch (methodId) {\n"
                       ,(char (*) [157])&result_11,
                       (Array<kj::StringTree> *)
                       "    default:\n      (void)context;\n      return ::capnp::Capability::Server::internalUnimplemented(\n          \""
                       ,(char (*) [111])&local_6f0,(Reader *)"\",\n          0x",
                       (char (*) [16])&local_a78,
                       (CappedArray<char,_17UL> *)
                       "ull, methodId);\n  }\n}\n#endif  // !CAPNP_LITE\n\n",
                       (char (*) [47])&defineText,in_stack_fffffffffffff578);
  sVar3 = result_11.size_;
  pSVar19 = result_11.ptr;
  if (result_11.ptr != (StringTree *)0x0) {
    result_11.ptr = (StringTree *)0x0;
    result_11.size_ = 0;
    iVar14 = (**(result_11.disposer)->_vptr_ArrayDisposer)
                       (result_11.disposer,pSVar19,0x38,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var,iVar14);
  }
  sVar3 = brandInitializers.scopes.branches.size_;
  pBVar7 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    iVar14 = (**(brandInitializers.scopes.branches.disposer)->_vptr_ArrayDisposer)
                       (brandInitializers.scopes.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_00,iVar14);
  }
  sVar3 = brandInitializers.scopes.text.content.size_;
  pcVar27 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    iVar14 = (**(brandInitializers.scopes.text.content.disposer)->_vptr_ArrayDisposer)
                       (brandInitializers.scopes.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_01,iVar14);
  }
  sVar3 = result_10.size_;
  pSVar19 = result_10.ptr;
  if (result_10.ptr != (StringTree *)0x0) {
    result_10.ptr = (StringTree *)0x0;
    result_10.size_ = 0;
    iVar14 = (**(result_10.disposer)->_vptr_ArrayDisposer)
                       (result_10.disposer,pSVar19,0x38,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_02,iVar14);
  }
  sVar3 = local_528.branches.size_;
  pBVar7 = local_528.branches.ptr;
  if (local_528.branches.ptr != (Branch *)0x0) {
    local_528.branches.ptr = (Branch *)0x0;
    local_528.branches.size_ = 0;
    iVar14 = (**(local_528.branches.disposer)->_vptr_ArrayDisposer)
                       (local_528.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_03,iVar14);
  }
  sVar3 = local_528.text.content.size_;
  pcVar27 = local_528.text.content.ptr;
  if (local_528.text.content.ptr != (char *)0x0) {
    local_528.text.content.ptr = (char *)0x0;
    local_528.text.content.size_ = 0;
    iVar14 = (**(local_528.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_528.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_04,iVar14);
  }
  sVar3 = result_9.size_;
  pSVar19 = result_9.ptr;
  if (result_9.ptr != (StringTree *)0x0) {
    result_9.ptr = (StringTree *)0x0;
    result_9.size_ = 0;
    iVar14 = (**(result_9.disposer)->_vptr_ArrayDisposer)
                       (result_9.disposer,pSVar19,0x38,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_05,iVar14);
  }
  sVar3 = result_8.size_;
  pSVar19 = result_8.ptr;
  if (result_8.ptr != (StringTree *)0x0) {
    result_8.ptr = (StringTree *)0x0;
    result_8.size_ = 0;
    iVar14 = (**(result_8.disposer)->_vptr_ArrayDisposer)
                       (result_8.disposer,pSVar19,0x38,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_06,iVar14);
  }
  sVar3 = local_308.branches.size_;
  pBVar7 = local_308.branches.ptr;
  if (local_308.branches.ptr != (Branch *)0x0) {
    local_308.branches.ptr = (Branch *)0x0;
    local_308.branches.size_ = 0;
    iVar14 = (**(local_308.branches.disposer)->_vptr_ArrayDisposer)
                       (local_308.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_07,iVar14);
  }
  sVar3 = local_308.text.content.size_;
  pcVar27 = local_308.text.content.ptr;
  if (local_308.text.content.ptr != (char *)0x0) {
    local_308.text.content.ptr = (char *)0x0;
    local_308.text.content.size_ = 0;
    iVar14 = (**(local_308.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_308.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_08,iVar14);
  }
  sVar3 = local_2d0.branches.size_;
  pBVar7 = local_2d0.branches.ptr;
  if (local_2d0.branches.ptr != (Branch *)0x0) {
    local_2d0.branches.ptr = (Branch *)0x0;
    local_2d0.branches.size_ = 0;
    iVar14 = (**(local_2d0.branches.disposer)->_vptr_ArrayDisposer)
                       (local_2d0.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_09,iVar14);
  }
  sVar3 = local_2d0.text.content.size_;
  pcVar27 = local_2d0.text.content.ptr;
  if (local_2d0.text.content.ptr != (char *)0x0) {
    local_2d0.text.content.ptr = (char *)0x0;
    local_2d0.text.content.size_ = 0;
    iVar14 = (**(local_2d0.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_2d0.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_10,iVar14);
  }
  sVar3 = local_298.branches.size_;
  pBVar7 = local_298.branches.ptr;
  if (local_298.branches.ptr != (Branch *)0x0) {
    local_298.branches.ptr = (Branch *)0x0;
    local_298.branches.size_ = 0;
    iVar14 = (**(local_298.branches.disposer)->_vptr_ArrayDisposer)
                       (local_298.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_11,iVar14);
  }
  sVar3 = local_298.text.content.size_;
  pcVar27 = local_298.text.content.ptr;
  if (local_298.text.content.ptr != (char *)0x0) {
    local_298.text.content.ptr = (char *)0x0;
    local_298.text.content.size_ = 0;
    iVar14 = (**(local_298.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_298.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_12,iVar14);
  }
  sVar3 = local_4e8.branches.size_;
  pBVar7 = local_4e8.branches.ptr;
  if (local_4e8.branches.ptr != (Branch *)0x0) {
    local_4e8.branches.ptr = (Branch *)0x0;
    local_4e8.branches.size_ = 0;
    iVar14 = (**(local_4e8.branches.disposer)->_vptr_ArrayDisposer)
                       (local_4e8.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_13,iVar14);
  }
  sVar3 = local_4e8.text.content.size_;
  pcVar27 = local_4e8.text.content.ptr;
  if (local_4e8.text.content.ptr != (char *)0x0) {
    local_4e8.text.content.ptr = (char *)0x0;
    local_4e8.text.content.size_ = 0;
    iVar14 = (**(local_4e8.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_4e8.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_14,iVar14);
  }
  sVar3 = local_4a8.branches.size_;
  pBVar7 = local_4a8.branches.ptr;
  if (local_4a8.branches.ptr != (Branch *)0x0) {
    local_4a8.branches.ptr = (Branch *)0x0;
    local_4a8.branches.size_ = 0;
    iVar14 = (**(local_4a8.branches.disposer)->_vptr_ArrayDisposer)
                       (local_4a8.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_15,iVar14);
  }
  sVar3 = local_4a8.text.content.size_;
  pcVar27 = local_4a8.text.content.ptr;
  if (local_4a8.text.content.ptr != (char *)0x0) {
    local_4a8.text.content.ptr = (char *)0x0;
    local_4a8.text.content.size_ = 0;
    iVar14 = (**(local_4a8.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_4a8.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_16,iVar14);
  }
  if (local_888 != (Branch *)0x0) {
    iVar14 = (**local_878->_vptr_ArrayDisposer)
                       (local_878,local_888,0x40,sStack_880,sStack_880,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_17,iVar14);
  }
  pAVar5 = result_2.content.disposer;
  sVar3 = result_2.content.size_;
  if (result_2.content.size_ != 0) {
    result_2.content.size_ = 0;
    result_2.content.disposer = (ArrayDisposer *)0x0;
    iVar14 = (**local_890->_vptr_ArrayDisposer)(local_890,sVar3,1,pAVar5,pAVar5,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_18,iVar14);
  }
  sVar3 = local_a30.branches.size_;
  pBVar7 = local_a30.branches.ptr;
  if (local_a30.branches.ptr != (Branch *)0x0) {
    local_a30.branches.ptr = (Branch *)0x0;
    local_a30.branches.size_ = 0;
    iVar14 = (**(local_a30.branches.disposer)->_vptr_ArrayDisposer)
                       (local_a30.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_19,iVar14);
  }
  sVar3 = local_a30.text.content.size_;
  pcVar27 = local_a30.text.content.ptr;
  if ((StringTree *)local_a30.text.content.ptr != (StringTree *)0x0) {
    local_a30.text.content.ptr = (char *)0x0;
    local_a30.text.content.size_ = 0;
    iVar14 = (**(local_a30.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_a30.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_20,iVar14);
  }
  sVar3 = result_7.size_;
  pSVar19 = result_7.ptr;
  if (result_7.ptr != (StringTree *)0x0) {
    result_7.ptr = (StringTree *)0x0;
    result_7.size_ = 0;
    iVar14 = (**(result_7.disposer)->_vptr_ArrayDisposer)
                       (result_7.disposer,pSVar19,0x38,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_21,iVar14);
  }
  sVar3 = result_6.size_;
  pSVar19 = result_6.ptr;
  if (result_6.ptr != (StringTree *)0x0) {
    result_6.ptr = (StringTree *)0x0;
    result_6.size_ = 0;
    iVar14 = (**(result_6.disposer)->_vptr_ArrayDisposer)
                       (result_6.disposer,pSVar19,0x38,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_22,iVar14);
  }
  sVar3 = local_260.branches.size_;
  pBVar7 = local_260.branches.ptr;
  if (local_260.branches.ptr != (Branch *)0x0) {
    local_260.branches.ptr = (Branch *)0x0;
    local_260.branches.size_ = 0;
    iVar14 = (**(local_260.branches.disposer)->_vptr_ArrayDisposer)
                       (local_260.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_23,iVar14);
  }
  sVar3 = local_260.text.content.size_;
  pcVar27 = local_260.text.content.ptr;
  if (local_260.text.content.ptr != (char *)0x0) {
    local_260.text.content.ptr = (char *)0x0;
    local_260.text.content.size_ = 0;
    iVar14 = (**(local_260.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_260.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_24,iVar14);
  }
  sVar3 = result_5.size_;
  pSVar19 = result_5.ptr;
  if (result_5.ptr != (StringTree *)0x0) {
    result_5.ptr = (StringTree *)0x0;
    result_5.size_ = 0;
    iVar14 = (**(result_5.disposer)->_vptr_ArrayDisposer)
                       (result_5.disposer,pSVar19,0x38,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_25,iVar14);
  }
  sVar3 = local_228.branches.size_;
  pBVar7 = local_228.branches.ptr;
  if (local_228.branches.ptr != (Branch *)0x0) {
    local_228.branches.ptr = (Branch *)0x0;
    local_228.branches.size_ = 0;
    iVar14 = (**(local_228.branches.disposer)->_vptr_ArrayDisposer)
                       (local_228.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_26,iVar14);
  }
  sVar3 = local_228.text.content.size_;
  pcVar27 = local_228.text.content.ptr;
  if (local_228.text.content.ptr != (char *)0x0) {
    local_228.text.content.ptr = (char *)0x0;
    local_228.text.content.size_ = 0;
    iVar14 = (**(local_228.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_228.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_27,iVar14);
  }
  uVar12 = uStack_460;
  lVar24 = local_468;
  if (local_468 != 0) {
    local_468 = 0;
    uStack_460 = 0;
    pIVar22 = (InterfaceText *)(**(code **)*local_458)(local_458,lVar24,1,uVar12,uVar12,0);
  }
  sVar3 = result_4.size_;
  pSVar19 = result_4.ptr;
  if (result_4.ptr != (StringTree *)0x0) {
    result_4.ptr = (StringTree *)0x0;
    result_4.size_ = 0;
    iVar14 = (**(result_4.disposer)->_vptr_ArrayDisposer)
                       (result_4.disposer,pSVar19,0x38,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_28,iVar14);
  }
  sVar3 = local_1f0.branches.size_;
  pBVar7 = local_1f0.branches.ptr;
  if (local_1f0.branches.ptr != (Branch *)0x0) {
    local_1f0.branches.ptr = (Branch *)0x0;
    local_1f0.branches.size_ = 0;
    iVar14 = (**(local_1f0.branches.disposer)->_vptr_ArrayDisposer)
                       (local_1f0.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_29,iVar14);
  }
  sVar3 = local_1f0.text.content.size_;
  pcVar27 = local_1f0.text.content.ptr;
  if (local_1f0.text.content.ptr != (char *)0x0) {
    local_1f0.text.content.ptr = (char *)0x0;
    local_1f0.text.content.size_ = 0;
    iVar14 = (**(local_1f0.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_1f0.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_30,iVar14);
  }
  sVar3 = result_3.size_;
  pSVar19 = result_3.ptr;
  if (result_3.ptr != (StringTree *)0x0) {
    result_3.ptr = (StringTree *)0x0;
    result_3.size_ = 0;
    iVar14 = (**(result_3.disposer)->_vptr_ArrayDisposer)
                       (result_3.disposer,pSVar19,0x38,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_31,iVar14);
  }
  sVar3 = local_1b8.branches.size_;
  pBVar7 = local_1b8.branches.ptr;
  if (local_1b8.branches.ptr != (Branch *)0x0) {
    local_1b8.branches.ptr = (Branch *)0x0;
    local_1b8.branches.size_ = 0;
    iVar14 = (**(local_1b8.branches.disposer)->_vptr_ArrayDisposer)
                       (local_1b8.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_32,iVar14);
  }
  sVar3 = local_1b8.text.content.size_;
  pcVar27 = local_1b8.text.content.ptr;
  if (local_1b8.text.content.ptr != (char *)0x0) {
    local_1b8.text.content.ptr = (char *)0x0;
    local_1b8.text.content.size_ = 0;
    iVar14 = (**(local_1b8.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_1b8.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_33,iVar14);
  }
  sVar3 = local_180.branches.size_;
  pBVar7 = local_180.branches.ptr;
  if (local_180.branches.ptr != (Branch *)0x0) {
    local_180.branches.ptr = (Branch *)0x0;
    local_180.branches.size_ = 0;
    iVar14 = (**(local_180.branches.disposer)->_vptr_ArrayDisposer)
                       (local_180.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_34,iVar14);
  }
  sVar3 = local_180.text.content.size_;
  pcVar27 = local_180.text.content.ptr;
  if (local_180.text.content.ptr != (char *)0x0) {
    local_180.text.content.ptr = (char *)0x0;
    local_180.text.content.size_ = 0;
    iVar14 = (**(local_180.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_180.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_35,iVar14);
  }
  sVar3 = local_148.branches.size_;
  pBVar7 = local_148.branches.ptr;
  if (local_148.branches.ptr != (Branch *)0x0) {
    local_148.branches.ptr = (Branch *)0x0;
    local_148.branches.size_ = 0;
    iVar14 = (**(local_148.branches.disposer)->_vptr_ArrayDisposer)
                       (local_148.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_36,iVar14);
  }
  sVar3 = local_148.text.content.size_;
  pcVar27 = local_148.text.content.ptr;
  if (local_148.text.content.ptr != (char *)0x0) {
    local_148.text.content.ptr = (char *)0x0;
    local_148.text.content.size_ = 0;
    iVar14 = (**(local_148.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_148.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_37,iVar14);
  }
  sVar3 = defineText.branches.size_;
  pBVar7 = defineText.branches.ptr;
  if (defineText.branches.ptr != (Branch *)0x0) {
    defineText.branches.ptr = (Branch *)0x0;
    defineText.branches.size_ = 0;
    iVar14 = (**(defineText.branches.disposer)->_vptr_ArrayDisposer)
                       (defineText.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_38,iVar14);
  }
  sVar3 = defineText.text.content.size_;
  pcVar27 = defineText.text.content.ptr;
  if (defineText.text.content.ptr != (char *)0x0) {
    defineText.text.content.ptr = (char *)0x0;
    defineText.text.content.size_ = 0;
    pIVar22 = (InterfaceText *)
              (*(code *)**(undefined8 **)
                          CONCAT44(defineText.text.content.disposer._4_4_,
                                   defineText.text.content.disposer._0_4_))
                        ((undefined8 *)
                         CONCAT44(defineText.text.content.disposer._4_4_,
                                  defineText.text.content.disposer._0_4_),pcVar27,1,sVar3,sVar3,0);
  }
  sVar3 = declareText.branches.size_;
  pBVar7 = declareText.branches.ptr;
  if (declareText.branches.ptr != (Branch *)0x0) {
    declareText.branches.ptr = (Branch *)0x0;
    declareText.branches.size_ = 0;
    iVar14 = (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
                       (declareText.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_39,iVar14);
  }
  sVar3 = declareText.text.content.size_;
  pcVar27 = declareText.text.content.ptr;
  if (declareText.text.content.ptr != (char *)0x0) {
    declareText.text.content.ptr = (char *)0x0;
    declareText.text.content.size_ = 0;
    pIVar22 = (InterfaceText *)
              (*(code *)**(undefined8 **)
                          CONCAT44(declareText.text.content.disposer._4_4_,
                                   declareText.text.content.disposer._0_4_))
                        ((undefined8 *)
                         CONCAT44(declareText.text.content.disposer._4_4_,
                                  declareText.text.content.disposer._0_4_),pcVar27,1,sVar3,sVar3,0);
  }
  sVar3 = templates.content.size_;
  pcVar27 = templates.content.ptr;
  if (templates.content.ptr != (char *)0x0) {
    templates.content.ptr = (char *)0x0;
    templates.content.size_ = 0;
    iVar14 = (**(templates.content.disposer)->_vptr_ArrayDisposer)
                       (templates.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_40,iVar14);
  }
  sVar3 = map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Var20 = map._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  if (map._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
    map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pIVar22 = (InterfaceText *)
              (*(code *)*puRam0000000000000000)
                        (0,p_Var20,0x40,sVar3,sVar3,
                         kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  p_Var20 = map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  uVar12 = map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  if (map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    pIVar22 = (InterfaceText *)
              (*(code *)**(undefined8 **)map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
                        (map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,uVar12,1,p_Var20,
                         p_Var20,0);
  }
  sVar3 = typeName.name.branches.size_;
  pBVar7 = typeName.name.branches.ptr;
  if (typeName.name.branches.ptr != (Branch *)0x0) {
    typeName.name.branches.ptr = (Branch *)0x0;
    typeName.name.branches.size_ = 0;
    iVar14 = (**(typeName.name.branches.disposer)->_vptr_ArrayDisposer)
                       (typeName.name.branches.disposer,pBVar7,0x40,sVar3,sVar3,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_41,iVar14);
  }
  sVar3 = typeName.name.text.content.size_;
  pcVar27 = typeName.name.text.content.ptr;
  if (typeName.name.text.content.ptr != (char *)0x0) {
    typeName.name.text.content.ptr = (char *)0x0;
    typeName.name.text.content.size_ = 0;
    iVar14 = (**(typeName.name.text.content.disposer)->_vptr_ArrayDisposer)
                       (typeName.name.text.content.disposer,pcVar27,1,sVar3,sVar3,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_42,iVar14);
  }
  if ((StringTree *)sVar9 != (StringTree *)0x0) {
    pIVar22 = (InterfaceText *)
              (**pAVar10->_vptr_ArrayDisposer)
                        (pAVar10,sVar9,0x48,local_9f8,local_9f8,
                         kj::ArrayDisposer::
                         Dispose_<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo,_false>::
                         destruct);
  }
  sVar3 = superclasses.size_;
  pEVar17 = superclasses.ptr;
  if (superclasses.ptr != (ExtendInfo *)0x0) {
    superclasses.ptr = (ExtendInfo *)0x0;
    superclasses.size_ = 0;
    iVar14 = (**(superclasses.disposer)->_vptr_ArrayDisposer)
                       (superclasses.disposer,pEVar17,0x48,sVar3,sVar3,
                        kj::ArrayDisposer::
                        Dispose_<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo,_false>::
                        destruct);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_43,iVar14);
  }
  if (firstElement != (ExtendInfo *)0x0) {
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,0x118,sVar16,
               sVar16,kj::ArrayDisposer::
                      Dispose_<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText,_false>::
                      destruct);
    pIVar22 = extraout_RAX;
  }
  sVar16 = fullName.content.size_;
  pcVar27 = fullName.content.ptr;
  if (fullName.content.ptr != (char *)0x0) {
    fullName.content.ptr = (char *)0x0;
    fullName.content.size_ = 0;
    iVar14 = (**(fullName.content.disposer)->_vptr_ArrayDisposer)
                       (fullName.content.disposer,pcVar27,1,sVar16,sVar16,0);
    pIVar22 = (InterfaceText *)CONCAT44(extraout_var_44,iVar14);
  }
  return pIVar22;
}

Assistant:

InterfaceText makeInterfaceText(kj::StringPtr scope, kj::StringPtr name, InterfaceSchema schema,
                                  kj::Array<kj::StringTree> nestedTypeDecls,
                                  const TemplateContext& templateContext) {
    auto fullName = kj::str(scope, name, templateContext.args());
    auto methods = KJ_MAP(m, schema.getMethods()) {
      return makeMethodText(fullName, m, templateContext);
    };

    auto proto = schema.getProto();
    auto hexId = kj::hex(proto.getId());

    auto superclasses = KJ_MAP(superclass, schema.getSuperclasses()) {
      return ExtendInfo { cppFullName(superclass, nullptr), superclass.getProto().getId() };
    };

    kj::Array<ExtendInfo> transitiveSuperclasses;
    {
      std::map<uint64_t, InterfaceSchema> map;
      getTransitiveSuperclasses(schema, map);
      map.erase(schema.getProto().getId());
      transitiveSuperclasses = KJ_MAP(entry, map) {
        return ExtendInfo { cppFullName(entry.second, nullptr), entry.second.getProto().getId() };
      };
    }

    CppTypeName typeName = cppFullName(schema, nullptr);

    CppTypeName clientName = typeName;
    clientName.addMemberType("Client");

    kj::String templates = kj::str(templateContext.allDecls());  // Ends with a newline

    // Private members struct
    kj::StringTree declareText = kj::strTree(
         "  #if !CAPNP_LITE\n"
         "  struct _capnpPrivate {\n"
         "    CAPNP_DECLARE_INTERFACE_HEADER(", hexId, ")\n");

    kj::StringTree defineText = kj::strTree(
        "// ", fullName, "\n",
        "#if !CAPNP_LITE\n",
        templates, "constexpr ::capnp::Kind ", fullName, "::_capnpPrivate::kind;\n",
        templates, "constexpr ::capnp::_::RawSchema const* ", fullName, "::_capnpPrivate::schema;\n");

    if (templateContext.isGeneric()) {
      auto brandInitializers = makeBrandInitializers(templateContext, schema);
      bool hasDeps = (brandInitializers.dependencies.size() != 0);

      declareText = kj::strTree(kj::mv(declareText),
          makeGenericDeclarations(templateContext, hasDeps));

      defineText = kj::strTree(kj::mv(defineText),
          makeGenericDefinitions(
              templateContext, fullName, kj::str(hexId), kj::mv(brandInitializers)));
    } else {
      declareText = kj::strTree(kj::mv(declareText),
        "    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return &schema->defaultBrand; }\n");
    }

    declareText = kj::strTree(kj::mv(declareText), "  };\n  #endif  // !CAPNP_LITE");
    defineText = kj::strTree(kj::mv(defineText), "#endif  // !CAPNP_LITE\n\n");

    return InterfaceText {
      kj::strTree(
          templateContext.hasParams() ? "  " : "", templateContext.decl(true),
          "  struct ", name, ";\n"),

      kj::strTree(
          templateContext.parentDecls(),
          templateContext.decl(scope == nullptr),
          "struct ", scope, name, " {\n",
          "  ", name, "() = delete;\n"
          "\n"
          "#if !CAPNP_LITE\n"
          "  class Client;\n"
          "  class Server;\n"
          "#endif  // !CAPNP_LITE\n"
          "\n",
          KJ_MAP(n, nestedTypeDecls) { return kj::mv(n); },
          "\n",
          kj::mv(declareText), "\n"
          "};\n"
          "\n"),

      kj::strTree(
          "#if !CAPNP_LITE\n",
          templateContext.allDecls(),
          "class ", fullName, "::Client\n"
          "    : public virtual ::capnp::Capability::Client",
          KJ_MAP(s, superclasses) {
            return kj::strTree(",\n      public virtual ", s.typeName.strNoTypename(), "::Client");
          }, " {\n"
          "public:\n"
          "  typedef ", name, " Calls;\n"
          "  typedef ", name, " Reads;\n"
          "\n"
          "  Client(decltype(nullptr));\n"
          "  explicit Client(::kj::Own< ::capnp::ClientHook>&& hook);\n"
          "  template <typename _t, typename = ::kj::EnableIf< ::kj::canConvert<_t*, Server*>()>>\n"
          "  Client(::kj::Own<_t>&& server);\n"
          "  template <typename _t, typename = ::kj::EnableIf< ::kj::canConvert<_t*, Client*>()>>\n"
          "  Client(::kj::Promise<_t>&& promise);\n"
          "  Client(::kj::Exception&& exception);\n"
          "  Client(Client&) = default;\n"
          "  Client(Client&&) = default;\n"
          "  Client& operator=(Client& other);\n"
          "  Client& operator=(Client&& other);\n"
          "\n",
          makeAsGenericDef(AsGenericRole::CLIENT, templateContext, name),
          KJ_MAP(m, methods) { return kj::mv(m.clientDecls); },
          "\n"
          "protected:\n"
          "  Client() = default;\n"
          "};\n"
          "\n",
          templateContext.allDecls(),
          "class ", fullName, "::Server\n"
          "    : public virtual ::capnp::Capability::Server",
          KJ_MAP(s, superclasses) {
            return kj::strTree(",\n      public virtual ", s.typeName.strNoTypename(), "::Server");
          }, " {\n"
          "public:\n",
          "  typedef ", name, " Serves;\n"
          "\n"
          "  ::kj::Promise<void> dispatchCall(uint64_t interfaceId, uint16_t methodId,\n"
          "      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context)\n"
          "      override;\n"
          "\n"
          "protected:\n",
          KJ_MAP(m, methods) { return kj::mv(m.serverDecls); },
          "\n"
          "  inline ", clientName, " thisCap() {\n"
          "    return ::capnp::Capability::Server::thisCap()\n"
          "        .template castAs<", typeName, ">();\n"
          "  }\n"
          "\n"
          "  ::kj::Promise<void> dispatchCallInternal(uint16_t methodId,\n"
          "      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context);\n"
          "};\n"
          "#endif  // !CAPNP_LITE\n"
          "\n"),

      kj::strTree(
          "#if !CAPNP_LITE\n",
          templateContext.allDecls(),
          "inline ", fullName, "::Client::Client(decltype(nullptr))\n"
          "    : ::capnp::Capability::Client(nullptr) {}\n",
          templateContext.allDecls(),
          "inline ", fullName, "::Client::Client(\n"
          "    ::kj::Own< ::capnp::ClientHook>&& hook)\n"
          "    : ::capnp::Capability::Client(::kj::mv(hook)) {}\n",
          templateContext.allDecls(),
          "template <typename _t, typename>\n"
          "inline ", fullName, "::Client::Client(::kj::Own<_t>&& server)\n"
          "    : ::capnp::Capability::Client(::kj::mv(server)) {}\n",
          templateContext.allDecls(),
          "template <typename _t, typename>\n"
          "inline ", fullName, "::Client::Client(::kj::Promise<_t>&& promise)\n"
          "    : ::capnp::Capability::Client(::kj::mv(promise)) {}\n",
          templateContext.allDecls(),
          "inline ", fullName, "::Client::Client(::kj::Exception&& exception)\n"
          "    : ::capnp::Capability::Client(::kj::mv(exception)) {}\n",
          templateContext.allDecls(),
          "inline ", clientName, "& ", fullName, "::Client::operator=(Client& other) {\n"
          "  ::capnp::Capability::Client::operator=(other);\n"
          "  return *this;\n"
          "}\n",
          templateContext.allDecls(),
          "inline ", clientName, "& ", fullName, "::Client::operator=(Client&& other) {\n"
          "  ::capnp::Capability::Client::operator=(kj::mv(other));\n"
          "  return *this;\n"
          "}\n"
          "\n",
          KJ_MAP(m, methods) { return kj::mv(m.inlineDefs); },
          "#endif  // !CAPNP_LITE\n"),

      kj::strTree(
          "#if !CAPNP_LITE\n",
          KJ_MAP(m, methods) { return kj::mv(m.sourceDefs); },
          templateContext.allDecls(),
          "::kj::Promise<void> ", fullName, "::Server::dispatchCall(\n"
          "    uint64_t interfaceId, uint16_t methodId,\n"
          "    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n"
          "  switch (interfaceId) {\n"
          "    case 0x", kj::hex(proto.getId()), "ull:\n"
          "      return dispatchCallInternal(methodId, context);\n",
          KJ_MAP(s, transitiveSuperclasses) {
            return kj::strTree(
              "    case 0x", kj::hex(s.id), "ull:\n"
              "      return ", s.typeName.strNoTypename(),
                         "::Server::dispatchCallInternal(methodId, context);\n");
          },
          "    default:\n"
          "      return internalUnimplemented(\"", proto.getDisplayName(), "\", interfaceId);\n"
          "  }\n"
          "}\n",
          templateContext.allDecls(),
          "::kj::Promise<void> ", fullName, "::Server::dispatchCallInternal(\n"
          "    uint16_t methodId,\n"
          "    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n"
          "  switch (methodId) {\n",
          KJ_MAP(m, methods) { return kj::mv(m.dispatchCase); },
          "    default:\n"
          "      (void)context;\n"
          "      return ::capnp::Capability::Server::internalUnimplemented(\n"
          "          \"", proto.getDisplayName(), "\",\n"
          "          0x", kj::hex(proto.getId()), "ull, methodId);\n"
          "  }\n"
          "}\n"
          "#endif  // !CAPNP_LITE\n"
          "\n",
          kj::mv(defineText))
    };
  }